

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

uchar * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  short sVar1;
  stbi__uint32 sVar2;
  undefined8 uVar3;
  byte bVar4;
  short sVar5;
  bool bVar6;
  _func_stbi_uc_ptr_stbi_uc_ptr_stbi_uc_ptr_stbi_uc_ptr_int_int *p_Var7;
  stbi_uc sVar8;
  byte bVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  byte *pbVar16;
  byte *pbVar17;
  ulong uVar18;
  void *pvVar19;
  code *pcVar20;
  uchar *puVar21;
  undefined8 *puVar22;
  stbi_uc *psVar23;
  float *data_00;
  stbi_uc *psVar24;
  stbi_uc *psVar25;
  stbi__context *psVar26;
  byte bVar27;
  undefined1 uVar28;
  short sVar29;
  int iVar30;
  stbi__uint32 sVar31;
  uint uVar32;
  stbi__gif_lzw sVar37;
  stbi_uc *psVar33;
  long lVar34;
  undefined8 *puVar35;
  uchar uVar36;
  int iVar38;
  stbi__gif_lzw sVar39;
  uint uVar41;
  uint uVar42;
  short *psVar43;
  long lVar44;
  ulong uVar45;
  stbi_uc **ppsVar46;
  stbi__uint32 z;
  stbi__gif_lzw sVar47;
  uint uVar48;
  stbi__gif_lzw sVar49;
  uint uVar50;
  uint *puVar51;
  long lVar52;
  long lVar53;
  stbi__uint32 y_00;
  ulong uVar54;
  uchar *puVar55;
  int iVar56;
  uint uVar57;
  uint uVar58;
  ulong uVar59;
  stbi__context *psVar60;
  bool bVar61;
  stbi_uc *coutput [4];
  short data [64];
  stbi__jpeg j;
  uint local_4a20;
  uint local_4a14;
  stbi_uc (*local_4a10) [4];
  int local_49e4;
  int local_49c4;
  uint local_49ac;
  int local_49a8;
  uint local_49a4;
  uint local_4990;
  stbi_uc *local_4968 [4];
  short local_4948 [4];
  long local_4940 [2];
  int local_4930 [42];
  undefined1 local_4888 [16];
  uint local_4878;
  int iStack_4874;
  int local_4870;
  uint uStack_486c;
  uint local_4868;
  stbi_uc local_4864 [2048];
  undefined2 uStack_4064;
  undefined1 auStack_4062 [4642];
  stbi__huffman local_2e40 [4];
  byte local_1400 [256];
  short local_1300 [2048];
  stbi__gif_lzw local_300;
  stbi__gif_lzw local_2fc;
  stbi__gif_lzw local_2f8;
  stbi__gif_lzw local_2f4;
  uint local_2e8;
  uint auStack_2e4 [5];
  stbi__gif_lzw local_2d0;
  int local_2cc [5];
  long local_2b8;
  void *local_2b0;
  void *pvStack_2a8;
  long alStack_2a0 [2];
  int local_290 [8];
  stbi__gif_lzw local_270;
  void *local_250;
  void *pvStack_248;
  stbi__gif_lzw local_210;
  void *local_1f0;
  void *pvStack_1e8;
  void *local_190;
  void *pvStack_188;
  undefined8 local_168;
  byte local_160;
  stbi__gif_lzw local_15c;
  stbi__gif_lzw local_158;
  stbi__gif_lzw local_154;
  stbi__gif_lzw local_150;
  stbi__gif_lzw local_14c;
  stbi__gif_lzw local_148;
  stbi__gif_lzw local_144;
  stbi__gif_lzw local_140;
  stbi__gif_lzw local_13c [4];
  stbi__gif_lzw local_12c;
  stbi__gif_lzw local_128;
  _func_void_stbi_uc_ptr_int_short_ptr *local_120;
  _func_void_stbi_uc_ptr_stbi_uc_ptr_stbi_uc_ptr_stbi_uc_ptr_int_int *local_118;
  _func_stbi_uc_ptr_stbi_uc_ptr_stbi_uc_ptr_stbi_uc_ptr_int_int *local_110;
  stbi_uc (*local_60) [4];
  uint local_58;
  int local_54;
  uint local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int iVar40;
  
  local_120 = stbi__idct_block;
  local_118 = stbi__YCbCr_to_RGB_row;
  local_110 = stbi__resample_row_hv_2;
  local_160 = 0xff;
  local_4888._0_8_ = s;
  sVar8 = stbi__get_marker((stbi__jpeg *)local_4888);
  if (sVar8 == 0xd8) {
    s->img_buffer = s->img_buffer_original;
    local_120 = stbi__idct_block;
    local_118 = stbi__YCbCr_to_RGB_row;
    local_110 = stbi__resample_row_hv_2;
    s->img_n = 0;
    if ((uint)req_comp < 5) {
      local_2b0 = (void *)0x0;
      pvStack_2a8 = (void *)0x0;
      local_250 = (void *)0x0;
      pvStack_248 = (void *)0x0;
      local_1f0 = (void *)0x0;
      pvStack_1e8 = (void *)0x0;
      local_190 = (void *)0x0;
      pvStack_188 = (void *)0x0;
      local_12c.prefix = 0;
      local_12c.first = '\0';
      local_12c.suffix = '\0';
      local_4888._0_8_ = s;
      iVar10 = stbi__decode_jpeg_header((stbi__jpeg *)local_4888,0);
      if (iVar10 == 0) {
LAB_0010e0cf:
        stbi__cleanup_jpeg((stbi__jpeg *)local_4888);
        return (uchar *)0x0;
      }
      bVar9 = stbi__get_marker((stbi__jpeg *)local_4888);
LAB_0010c26a:
      if (bVar9 != 0xda) {
        if (bVar9 == 0xd9) {
          uVar58 = *(int *)(local_4888._0_8_ + 8);
          psVar26 = (stbi__context *)local_4888._0_8_;
          if (0 < (int)uVar58 && local_158 != (stbi__gif_lzw)0x0) {
            lVar44 = 0;
            do {
              iVar10 = local_2cc[lVar44 * 0x18 + 1] + 7 >> 3;
              if (0 < iVar10) {
                uVar58 = local_2cc[lVar44 * 0x18] + 7 >> 3;
                iVar56 = 0;
                do {
                  if (0 < (int)uVar58) {
                    uVar54 = 0;
                    do {
                      psVar43 = (short *)((long)((local_290[lVar44 * 0x18] * iVar56 + (int)uVar54) *
                                                0x40) * 2 + alStack_2a0[lVar44 * 0xc + 1]);
                      uVar48 = auStack_2e4[lVar44 * 0x18 + 2];
                      lVar34 = 0;
                      do {
                        psVar43[lVar34] =
                             (ushort)local_1400[lVar34 + (long)(int)uVar48 * 0x40] * psVar43[lVar34]
                        ;
                        lVar34 = lVar34 + 1;
                      } while (lVar34 != 0x40);
                      (*local_120)((stbi_uc *)
                                   ((long)(iVar56 * 8 * local_2cc[lVar44 * 0x18 + 2]) +
                                    (&local_2b8)[lVar44 * 0xc] + uVar54 * 8),
                                   local_2cc[lVar44 * 0x18 + 2],psVar43);
                      uVar54 = uVar54 + 1;
                    } while (uVar54 != uVar58);
                  }
                  iVar56 = iVar56 + 1;
                  psVar26 = (stbi__context *)local_4888._0_8_;
                } while (iVar56 != iVar10);
              }
              lVar44 = lVar44 + 1;
              uVar58 = psVar26->img_n;
            } while (lVar44 < (int)uVar58);
          }
          p_Var7 = local_110;
          if (req_comp == 0) {
            req_comp = uVar58;
          }
          uVar48 = 1;
          if (2 < req_comp) {
            uVar48 = uVar58;
          }
          if (uVar58 != 3) {
            uVar48 = uVar58;
          }
          sVar2 = psVar26->img_x;
          if ((int)uVar48 < 1) {
LAB_0010dcfe:
            uVar58 = psVar26->img_y;
            psVar23 = (stbi_uc *)(ulong)uVar58;
            puVar21 = (uchar *)malloc((ulong)(sVar2 * req_comp * uVar58 + 1));
            if (puVar21 != (uchar *)0x0) {
              if (uVar58 != 0) {
                iVar10 = 0;
                uVar58 = 0;
                do {
                  sVar2 = psVar26->img_x;
                  if (0 < (int)uVar48) {
                    ppsVar46 = local_4968;
                    lVar44 = 0;
                    do {
                      puVar22 = (undefined8 *)((long)local_4940 + lVar44 + 8);
                      iVar56 = *(int *)((long)local_4930 + lVar44 + 0xc);
                      iVar38 = *(int *)((long)local_4930 + lVar44 + 4);
                      iVar30 = iVar38 >> 1;
                      puVar35 = puVar22;
                      if (iVar56 < iVar30) {
                        puVar35 = (undefined8 *)((long)local_4940 + lVar44);
                      }
                      if (iVar30 <= iVar56) {
                        puVar22 = (undefined8 *)((long)local_4940 + lVar44);
                      }
                      psVar23 = (stbi_uc *)
                                (**(code **)((long)local_4948 + lVar44))
                                          (*(undefined8 *)((long)alStack_2a0 + lVar44 * 2),*puVar35,
                                           *puVar22,*(undefined4 *)((long)local_4930 + lVar44 + 8),
                                           *(undefined4 *)((long)local_4930 + lVar44));
                      *ppsVar46 = psVar23;
                      *(int *)((long)local_4930 + lVar44 + 0xc) = iVar56 + 1;
                      if (iVar38 <= iVar56 + 1) {
                        *(undefined4 *)((long)local_4930 + lVar44 + 0xc) = 0;
                        lVar34 = *(long *)((long)local_4940 + lVar44 + 8);
                        *(long *)((long)local_4940 + lVar44) = lVar34;
                        iVar56 = *(int *)((long)local_4930 + lVar44 + 0x10) + 1;
                        *(int *)((long)local_4930 + lVar44 + 0x10) = iVar56;
                        if (iVar56 < *(int *)((long)local_2cc + lVar44 * 2 + 4)) {
                          *(long *)((long)local_4940 + lVar44 + 8) =
                               lVar34 + *(int *)((long)local_2cc + lVar44 * 2 + 8);
                        }
                      }
                      lVar44 = lVar44 + 0x30;
                      ppsVar46 = ppsVar46 + 1;
                      psVar23 = local_4968[0];
                      psVar26 = (stbi__context *)local_4888._0_8_;
                    } while ((ulong)uVar48 * 0x30 != lVar44);
                  }
                  if (req_comp < 3) {
                    if (req_comp == 1) {
                      if (psVar26->img_x != 0) {
                        uVar54 = 0;
                        do {
                          puVar21[uVar54 + sVar2 * iVar10] = psVar23[uVar54];
                          uVar54 = uVar54 + 1;
                        } while (uVar54 < psVar26->img_x);
                      }
                    }
                    else if (psVar26->img_x != 0) {
                      uVar54 = 0;
                      do {
                        puVar21[uVar54 * 2 + (ulong)(sVar2 * iVar10)] = psVar23[uVar54];
                        puVar21[uVar54 * 2 + (ulong)(sVar2 * iVar10) + 1] = 0xff;
                        uVar54 = uVar54 + 1;
                      } while (uVar54 < psVar26->img_x);
                    }
                  }
                  else if (psVar26->img_n == 3) {
                    (*local_118)(puVar21 + uVar58 * req_comp * sVar2,psVar23,local_4968[1],
                                 local_4968[2],psVar26->img_x,req_comp);
                    psVar26 = (stbi__context *)local_4888._0_8_;
                  }
                  else if (psVar26->img_x != 0) {
                    puVar55 = puVar21 + (ulong)(sVar2 * iVar10) + 3;
                    uVar54 = 0;
                    do {
                      uVar36 = psVar23[uVar54];
                      puVar55[-1] = uVar36;
                      puVar55[-2] = uVar36;
                      puVar55[-3] = uVar36;
                      *puVar55 = 0xff;
                      uVar54 = uVar54 + 1;
                      puVar55 = puVar55 + (uint)req_comp;
                    } while (uVar54 < psVar26->img_x);
                  }
                  uVar58 = uVar58 + 1;
                  iVar10 = iVar10 + req_comp;
                } while (uVar58 < psVar26->img_y);
              }
              stbi__cleanup_jpeg((stbi__jpeg *)local_4888);
              *x = *(stbi__uint32 *)local_4888._0_8_;
              *y = *(stbi__uint32 *)(local_4888._0_8_ + 4);
              if (comp != (int *)0x0) {
                *comp = *(int *)(local_4888._0_8_ + 8);
                return puVar21;
              }
              return puVar21;
            }
          }
          else {
            lVar44 = 0;
            while( true ) {
              pvVar19 = malloc((ulong)(sVar2 + 3));
              *(void **)((long)alStack_2a0 + lVar44 * 2) = pvVar19;
              if (pvVar19 == (void *)0x0) break;
              uVar54 = (long)(int)local_300 / (long)*(int *)((long)auStack_2e4 + lVar44 * 2);
              iVar10 = (int)uVar54;
              *(int *)((long)local_4930 + lVar44) = iVar10;
              iVar56 = (int)local_2fc / *(int *)((long)auStack_2e4 + lVar44 * 2 + 4);
              *(int *)((long)local_4930 + lVar44 + 4) = iVar56;
              *(int *)((long)local_4930 + lVar44 + 0xc) = iVar56 >> 1;
              *(int *)((long)local_4930 + lVar44 + 8) =
                   (int)((ulong)((sVar2 - 1) + iVar10) / (uVar54 & 0xffffffff));
              *(undefined4 *)((long)local_4930 + lVar44 + 0x10) = 0;
              uVar3 = *(undefined8 *)((long)&local_2b8 + lVar44 * 2);
              *(undefined8 *)((long)local_4940 + lVar44 + 8) = uVar3;
              *(undefined8 *)((long)local_4940 + lVar44) = uVar3;
              if (iVar10 == 2) {
                pcVar20 = stbi__resample_row_h_2;
                if ((iVar56 != 1) && (pcVar20 = p_Var7, iVar56 != 2)) goto LAB_0010dce2;
              }
              else if (iVar10 == 1) {
                pcVar20 = stbi__resample_row_generic;
                if (iVar56 == 2) {
                  pcVar20 = stbi__resample_row_v_2;
                }
                if (iVar56 == 1) {
                  pcVar20 = resample_row_1;
                }
              }
              else {
LAB_0010dce2:
                pcVar20 = stbi__resample_row_generic;
              }
              *(code **)((long)local_4948 + lVar44) = pcVar20;
              lVar44 = lVar44 + 0x30;
              if ((ulong)uVar48 * 0x30 == lVar44) goto LAB_0010dcfe;
            }
          }
          stbi__cleanup_jpeg((stbi__jpeg *)local_4888);
          goto LAB_0010e0aa;
        }
        iVar10 = stbi__process_marker((stbi__jpeg *)local_4888,(uint)bVar9);
        if (iVar10 != 0) goto LAB_0010c292;
        goto LAB_0010e0cf;
      }
      iVar10 = stbi__get16be((stbi__context *)local_4888._0_8_);
      uVar3 = local_4888._0_8_;
      pbVar17 = *(stbi_uc **)(local_4888._0_8_ + 0xb8);
      if (pbVar17 < *(stbi_uc **)(local_4888._0_8_ + 0xc0)) {
        *(byte **)(local_4888._0_8_ + 0xb8) = pbVar17 + 1;
        bVar9 = *pbVar17;
LAB_0010c331:
        local_140._1_3_ = 0;
        local_140.prefix._0_1_ = bVar9;
        if (((byte)(bVar9 - 5) < 0xfc) || (*(int *)(local_4888._0_8_ + 8) < (int)local_140))
        goto LAB_0010e0c1;
        if (iVar10 == (int)local_140 * 2 + 6) {
          lVar44 = 0;
          psVar26 = (stbi__context *)local_4888._0_8_;
          do {
            puVar51 = &local_2e8;
            pbVar16 = psVar26->img_buffer;
            pbVar17 = psVar26->img_buffer_end;
            if (pbVar16 < pbVar17) {
              psVar26->img_buffer = pbVar16 + 1;
              uVar58 = (uint)*pbVar16;
              pbVar16 = pbVar16 + 1;
            }
            else if (psVar26->read_from_callbacks == 0) {
              uVar58 = 0;
            }
            else {
              psVar23 = psVar26->buffer_start;
              iVar10 = (*(psVar26->io).read)(psVar26->io_user_data,(char *)psVar23,psVar26->buflen);
              if (iVar10 == 0) {
                psVar26->read_from_callbacks = 0;
                psVar33 = psVar26->buffer_start + 1;
                psVar26->buffer_start[0] = '\0';
                uVar58 = 0;
              }
              else {
                psVar33 = psVar23 + iVar10;
                uVar58 = (uint)*psVar23;
              }
              psVar26->img_buffer_end = psVar33;
              psVar26->img_buffer = psVar26->buffer_start + 1;
              pbVar16 = *(stbi_uc **)(local_4888._0_8_ + 0xb8);
              pbVar17 = *(stbi_uc **)(local_4888._0_8_ + 0xc0);
              psVar26 = (stbi__context *)local_4888._0_8_;
            }
            if (pbVar16 < pbVar17) {
              psVar26->img_buffer = pbVar16 + 1;
              uVar48 = (uint)*pbVar16;
            }
            else if (psVar26->read_from_callbacks == 0) {
              uVar48 = 0;
            }
            else {
              psVar23 = psVar26->buffer_start;
              iVar10 = (*(psVar26->io).read)(psVar26->io_user_data,(char *)psVar23,psVar26->buflen);
              if (iVar10 == 0) {
                psVar26->read_from_callbacks = 0;
                psVar33 = psVar26->buffer_start + 1;
                psVar26->buffer_start[0] = '\0';
                uVar48 = 0;
              }
              else {
                psVar33 = psVar23 + iVar10;
                uVar48 = (uint)*psVar23;
              }
              psVar26->img_buffer_end = psVar33;
              psVar26->img_buffer = psVar26->buffer_start + 1;
              psVar26 = (stbi__context *)local_4888._0_8_;
            }
            sVar39 = (stbi__gif_lzw)psVar26->img_n;
            if ((long)(int)sVar39 < 1) {
              uVar54 = 0;
            }
            else {
              uVar54 = 0;
              while (*puVar51 != uVar58) {
                uVar54 = uVar54 + 1;
                puVar51 = puVar51 + 0x18;
                if ((long)(int)sVar39 == uVar54) goto LAB_0010e0cf;
              }
            }
            if (SUB84(uVar54,0) == sVar39) goto LAB_0010e0cf;
            auStack_2e4[(uVar54 & 0xffffffff) * 0x18 + 3] = uVar48 >> 4;
            if (0x3f < (byte)uVar48) {
              stbi__g_failure_reason = "bad DC huff";
              goto LAB_0010e0cf;
            }
            auStack_2e4[(uVar54 & 0xffffffff) * 0x18 + 4] = uVar48 & 0xf;
            if (3 < (uVar48 & 0xf)) {
              stbi__g_failure_reason = "bad AC huff";
              goto LAB_0010e0cf;
            }
            local_13c[lVar44] = SUB84(uVar54,0);
            lVar44 = lVar44 + 1;
          } while (lVar44 < (int)local_140);
          pbVar17 = psVar26->img_buffer;
          pbVar16 = psVar26->img_buffer_end;
          if (pbVar17 < pbVar16) {
            psVar26->img_buffer = pbVar17 + 1;
            bVar9 = *pbVar17;
            pbVar17 = pbVar17 + 1;
          }
          else if (psVar26->read_from_callbacks == 0) {
            bVar9 = 0;
          }
          else {
            psVar23 = psVar26->buffer_start;
            iVar10 = (*(psVar26->io).read)(psVar26->io_user_data,(char *)psVar23,psVar26->buflen);
            if (iVar10 == 0) {
              psVar26->read_from_callbacks = 0;
              psVar33 = psVar26->buffer_start + 1;
              psVar26->buffer_start[0] = '\0';
              bVar9 = 0;
            }
            else {
              psVar33 = psVar23 + iVar10;
              bVar9 = *psVar23;
            }
            psVar26->img_buffer_end = psVar33;
            psVar26->img_buffer = psVar26->buffer_start + 1;
            pbVar17 = *(stbi_uc **)(local_4888._0_8_ + 0xb8);
            pbVar16 = *(stbi_uc **)(local_4888._0_8_ + 0xc0);
            psVar26 = (stbi__context *)local_4888._0_8_;
          }
          local_154._1_3_ = 0;
          local_154.prefix._0_1_ = bVar9;
          if (pbVar17 < pbVar16) {
            psVar26->img_buffer = pbVar17 + 1;
            local_150._1_3_ = 0;
            local_150.prefix._0_1_ = *pbVar17;
            pbVar17 = pbVar17 + 1;
          }
          else if (psVar26->read_from_callbacks == 0) {
            local_150.prefix = 0;
            local_150.first = '\0';
            local_150.suffix = '\0';
          }
          else {
            psVar23 = psVar26->buffer_start;
            iVar10 = (*(psVar26->io).read)(psVar26->io_user_data,(char *)psVar23,psVar26->buflen);
            if (iVar10 == 0) {
              psVar26->read_from_callbacks = 0;
              psVar33 = psVar26->buffer_start + 1;
              psVar26->buffer_start[0] = '\0';
              local_150.prefix = 0;
              local_150.first = '\0';
              local_150.suffix = '\0';
            }
            else {
              psVar33 = psVar23 + iVar10;
              local_150._1_3_ = 0;
              local_150.prefix._0_1_ = *psVar23;
            }
            psVar26->img_buffer_end = psVar33;
            psVar26->img_buffer = psVar26->buffer_start + 1;
            pbVar17 = *(stbi_uc **)(local_4888._0_8_ + 0xb8);
            pbVar16 = *(stbi_uc **)(local_4888._0_8_ + 0xc0);
            psVar26 = (stbi__context *)local_4888._0_8_;
          }
          if (pbVar17 < pbVar16) {
            psVar26->img_buffer = pbVar17 + 1;
            uVar58 = (uint)*pbVar17;
          }
          else if (psVar26->read_from_callbacks == 0) {
            uVar58 = 0;
          }
          else {
            psVar23 = psVar26->buffer_start;
            iVar10 = (*(psVar26->io).read)(psVar26->io_user_data,(char *)psVar23,psVar26->buflen);
            if (iVar10 == 0) {
              psVar26->read_from_callbacks = 0;
              psVar33 = psVar26->buffer_start + 1;
              psVar26->buffer_start[0] = '\0';
              uVar58 = 0;
            }
            else {
              psVar33 = psVar23 + iVar10;
              uVar58 = (uint)*psVar23;
            }
            psVar26->img_buffer_end = psVar33;
            psVar26->img_buffer = psVar26->buffer_start + 1;
          }
          sVar39 = local_13c[0];
          local_14c = (stbi__gif_lzw)(uVar58 >> 4);
          local_148 = (stbi__gif_lzw)(uVar58 & 0xf);
          if (local_158 == (stbi__gif_lzw)0x0) {
            if ((local_154 != (stbi__gif_lzw)0x0) ||
               ((0xf < (byte)uVar58 || (local_148 != (stbi__gif_lzw)0x0)))) {
LAB_0010e309:
              stbi__g_failure_reason = "bad SOS";
              goto LAB_0010e0cf;
            }
            local_150.prefix = 0x3f;
            local_150.first = '\0';
            local_150.suffix = '\0';
          }
          else if ((((0x3f < (int)local_154) || (0x3f < (int)local_150)) ||
                   ((int)local_150 < (int)local_154)) ||
                  ((0xdf < (byte)uVar58 || (0xd < (uint)local_148)))) goto LAB_0010e309;
          sVar37 = local_12c;
          if (local_12c == (stbi__gif_lzw)0x0) {
            sVar37.prefix = -1;
            sVar37.first = 0xff;
            sVar37.suffix = '\x7f';
          }
          local_168._0_2_ = 0;
          local_168._2_1_ = '\0';
          local_168._3_1_ = '\0';
          local_168._4_2_ = 0;
          local_168._6_1_ = '\0';
          local_168._7_1_ = '\0';
          local_15c.prefix = 0;
          local_15c.first = '\0';
          local_15c.suffix = '\0';
          local_210.prefix = 0;
          local_210.first = '\0';
          local_210.suffix = '\0';
          local_270.prefix = 0;
          local_270.first = '\0';
          local_270.suffix = '\0';
          local_2d0.prefix = 0;
          local_2d0.first = '\0';
          local_2d0.suffix = '\0';
          local_160 = 0xff;
          local_128 = sVar37;
          local_144.prefix = 0;
          local_144.first = '\0';
          local_144.suffix = '\0';
          if (local_158 == (stbi__gif_lzw)0x0) {
            if (local_140 == (stbi__gif_lzw)0x1) {
              lVar44 = (long)(int)local_13c[0];
              iVar10 = local_2cc[lVar44 * 0x18 + 1] + 7 >> 3;
              bVar61 = true;
              if (0 < iVar10) {
                uVar58 = local_2cc[lVar44 * 0x18] + 7 >> 3;
                iVar38 = 0;
                iVar56 = 0;
                do {
                  if (0 < (int)uVar58) {
                    lVar34 = 0;
                    do {
                      iVar30 = stbi__jpeg_decode_block
                                         ((stbi__jpeg *)local_4888,local_4948,
                                          (stbi__huffman *)
                                          (local_4888 +
                                          (long)(int)auStack_2e4[lVar44 * 0x18 + 3] * 0x690 + 8),
                                          local_2e40 + (int)auStack_2e4[lVar44 * 0x18 + 4],
                                          local_1300 +
                                          (long)(int)auStack_2e4[lVar44 * 0x18 + 4] * 0x200,
                                          (int)sVar39,
                                          local_1400 +
                                          (long)(int)auStack_2e4[lVar44 * 0x18 + 2] * 0x40);
                      if (iVar30 == 0) goto LAB_0010d4de;
                      (*local_120)((stbi_uc *)
                                   ((long)(iVar38 * local_2cc[lVar44 * 0x18 + 2]) +
                                    (&local_2b8)[lVar44 * 0xc] + lVar34),
                                   local_2cc[lVar44 * 0x18 + 2],local_4948);
                      sVar37 = local_128;
                      local_128 = (stbi__gif_lzw)((int)local_128 + -1);
                      if ((int)sVar37 < 2) {
                        if ((int)local_168._4_4_ < 0x18) {
                          stbi__grow_buffer_unsafe((stbi__jpeg *)local_4888);
                        }
                        if ((local_160 & 0xf8) != 0xd0) goto LAB_0010d0e2;
                        local_168._0_2_ = 0;
                        local_168._2_1_ = '\0';
                        local_168._3_1_ = '\0';
                        local_168._4_2_ = 0;
                        local_168._6_1_ = '\0';
                        local_168._7_1_ = '\0';
                        local_15c.prefix = 0;
                        local_15c.first = '\0';
                        local_15c.suffix = '\0';
                        local_210.prefix = 0;
                        local_210.first = '\0';
                        local_210.suffix = '\0';
                        local_270.prefix = 0;
                        local_270.first = '\0';
                        local_270.suffix = '\0';
                        local_2d0.prefix = 0;
                        local_2d0.first = '\0';
                        local_2d0.suffix = '\0';
                        local_160 = 0xff;
                        local_128 = local_12c;
                        if (local_12c == (stbi__gif_lzw)0x0) {
                          local_128.prefix = -1;
                          local_128.first = 0xff;
                          local_128.suffix = '\x7f';
                        }
                        local_144.prefix = 0;
                        local_144.first = '\0';
                        local_144.suffix = '\0';
                      }
                      lVar34 = lVar34 + 8;
                    } while ((ulong)uVar58 * 8 - lVar34 != 0);
                  }
                  iVar56 = iVar56 + 1;
                  iVar38 = iVar38 + 8;
                } while (iVar56 != iVar10);
LAB_0010d0e2:
                bVar61 = true;
              }
            }
            else {
              bVar61 = true;
              if (0 < (int)local_2f4) {
                iVar10 = 0;
                sVar39 = local_2f4;
                sVar47 = local_2f8;
                do {
                  if (0 < (int)sVar47) {
                    iVar56 = 0;
                    do {
                      if (0 < (int)local_140) {
                        lVar44 = 0;
                        sVar39 = local_140;
                        do {
                          sVar37 = local_13c[lVar44];
                          lVar34 = (long)(int)sVar37;
                          uVar58 = auStack_2e4[lVar34 * 0x18 + 1];
                          if (0 < (int)uVar58) {
                            uVar48 = auStack_2e4[lVar34 * 0x18];
                            iVar38 = 0;
                            do {
                              if (0 < (int)uVar48) {
                                iVar30 = 0;
                                do {
                                  uVar58 = auStack_2e4[lVar34 * 0x18 + 1];
                                  iVar11 = stbi__jpeg_decode_block
                                                     ((stbi__jpeg *)local_4888,local_4948,
                                                      (stbi__huffman *)
                                                      (local_4888 +
                                                      (long)(int)auStack_2e4[lVar34 * 0x18 + 3] *
                                                      0x690 + 8),
                                                      local_2e40 +
                                                      (int)auStack_2e4[lVar34 * 0x18 + 4],
                                                      local_1300 +
                                                      (long)(int)auStack_2e4[lVar34 * 0x18 + 4] *
                                                      0x200,(int)sVar37,
                                                      local_1400 +
                                                      (long)(int)auStack_2e4[lVar34 * 0x18 + 2] *
                                                      0x40);
                                  if (iVar11 == 0) goto LAB_0010d4de;
                                  (*local_120)((stbi_uc *)
                                               ((long)(int)((uVar48 * iVar56 + iVar30) * 8) +
                                               (long)(int)((uVar58 * iVar10 + iVar38) *
                                                           local_2cc[lVar34 * 0x18 + 2] * 8) +
                                               (&local_2b8)[lVar34 * 0xc]),
                                               local_2cc[lVar34 * 0x18 + 2],local_4948);
                                  iVar30 = iVar30 + 1;
                                  uVar48 = auStack_2e4[lVar34 * 0x18];
                                } while (iVar30 < (int)uVar48);
                                uVar58 = auStack_2e4[lVar34 * 0x18 + 1];
                              }
                              iVar38 = iVar38 + 1;
                              sVar39 = local_140;
                            } while (iVar38 < (int)uVar58);
                          }
                          lVar44 = lVar44 + 1;
                          sVar37 = local_128;
                        } while (lVar44 < (int)sVar39);
                      }
                      bVar61 = true;
                      local_128 = (stbi__gif_lzw)((int)sVar37 + -1);
                      if ((int)sVar37 < 2) {
                        if ((int)local_168._4_4_ < 0x18) {
                          stbi__grow_buffer_unsafe((stbi__jpeg *)local_4888);
                        }
                        if ((local_160 & 0xf8) != 0xd0) goto LAB_0010d4e0;
                        local_168._0_2_ = 0;
                        local_168._2_1_ = '\0';
                        local_168._3_1_ = '\0';
                        local_168._4_2_ = 0;
                        local_168._6_1_ = '\0';
                        local_168._7_1_ = '\0';
                        local_15c.prefix = 0;
                        local_15c.first = '\0';
                        local_15c.suffix = '\0';
                        local_210.prefix = 0;
                        local_210.first = '\0';
                        local_210.suffix = '\0';
                        local_270.prefix = 0;
                        local_270.first = '\0';
                        local_270.suffix = '\0';
                        local_2d0.prefix = 0;
                        local_2d0.first = '\0';
                        local_2d0.suffix = '\0';
                        local_160 = 0xff;
                        local_128 = local_12c;
                        if (local_12c == (stbi__gif_lzw)0x0) {
                          local_128.prefix = -1;
                          local_128.first = 0xff;
                          local_128.suffix = '\x7f';
                        }
                        local_144.prefix = 0;
                        local_144.first = '\0';
                        local_144.suffix = '\0';
                      }
                      iVar56 = iVar56 + 1;
                      sVar39 = local_2f4;
                      sVar47 = local_2f8;
                      sVar37 = local_128;
                    } while (iVar56 < (int)local_2f8);
                  }
                  bVar61 = true;
                  iVar10 = iVar10 + 1;
                } while (iVar10 < (int)sVar39);
              }
            }
            goto LAB_0010d4e0;
          }
          if (local_140 == (stbi__gif_lzw)0x1) {
            lVar44 = (long)(int)local_13c[0];
            iVar10 = local_2cc[lVar44 * 0x18 + 1] + 7 >> 3;
            if (0 < iVar10) {
              iVar56 = local_2cc[lVar44 * 0x18] + 7 >> 3;
              local_4a14 = 0;
              do {
                if (0 < iVar56) {
                  iVar38 = 0;
                  do {
                    psVar43 = (short *)((long)(int)((local_290[lVar44 * 0x18] * local_4a14 + iVar38)
                                                   * 0x40) * 2 + alStack_2a0[lVar44 * 0xc + 1]);
                    uVar54 = (ulong)(int)local_154;
                    if (uVar54 == 0) {
                      iVar30 = stbi__jpeg_decode_block_prog_dc
                                         ((stbi__jpeg *)local_4888,psVar43,
                                          (stbi__huffman *)
                                          (local_4888 +
                                          (long)(int)auStack_2e4[lVar44 * 0x18 + 3] * 0x690 + 8),
                                          (int)sVar39);
                      if (iVar30 == 0) goto LAB_0010e0cf;
                    }
                    else {
                      lVar34 = (long)(int)auStack_2e4[lVar44 * 0x18 + 4];
                      bVar9 = (byte)local_148.prefix;
                      if (local_14c == (stbi__gif_lzw)0x0) {
                        sVar37 = local_168._4_4_;
                        if (local_144 == (stbi__gif_lzw)0x0) {
                          do {
                            if ((int)sVar37 < 0x10) {
                              stbi__grow_buffer_unsafe((stbi__jpeg *)local_4888);
                            }
                            uVar18 = (ulong)((uint)local_168._0_4_ >> 0x17);
                            uVar58 = (uint)local_1300[lVar34 * 0x200 + uVar18];
                            iVar30 = (int)uVar54;
                            if (local_1300[lVar34 * 0x200 + uVar18] == 0) {
                              if ((int)local_168._4_4_ < 0x10) {
                                stbi__grow_buffer_unsafe((stbi__jpeg *)local_4888);
                                uVar18 = (ulong)((uint)local_168._0_4_ >> 0x17);
                              }
                              uVar54 = (ulong)local_2e40[lVar34].fast[uVar18];
                              if (uVar54 == 0xff) {
                                lVar52 = 0;
                                do {
                                  lVar53 = lVar52;
                                  lVar52 = lVar53 + 1;
                                } while (local_2e40[lVar34].maxcode[lVar53 + 10] <=
                                         (uint)local_168._0_4_ >> 0x10);
                                if (lVar52 == 8) goto LAB_0010eb2a;
                                if ((int)local_168._4_4_ < (int)(lVar53 + 10)) goto LAB_0010eb34;
                                uVar58 = (uint)local_168._0_4_ >> (0x17U - (char)lVar52 & 0x1f);
                                sVar47 = (stbi__gif_lzw)
                                         ((int)local_168._0_4_ << ((byte)(lVar53 + 10) & 0x1f));
                                sVar37 = (stbi__gif_lzw)(((int)local_168._4_4_ - (int)lVar52) + -9);
                                local_168._4_4_ = sVar37;
                                local_168._0_4_ = sVar47;
                                uVar54 = (ulong)(int)((uVar58 & stbi__bmask[lVar53 + 10]) +
                                                     local_2e40[lVar34].delta[lVar53 + 10]);
                              }
                              else {
                                bVar27 = local_2e40[lVar34].size[uVar54];
                                sVar37 = (stbi__gif_lzw)((int)local_168._4_4_ - (uint)bVar27);
                                if ((int)local_168._4_4_ < (int)(uint)bVar27) goto LAB_0010eb34;
                                sVar47 = (stbi__gif_lzw)((int)local_168._0_4_ << (bVar27 & 0x1f));
                                local_168._4_4_ = sVar37;
                                local_168._0_4_ = sVar47;
                              }
                              bVar27 = local_2e40[lVar34].values[uVar54];
                              uVar48 = bVar27 & 0xf;
                              bVar4 = bVar27 >> 4;
                              uVar58 = (uint)bVar4;
                              if ((bVar27 & 0xf) == 0) {
                                if (bVar27 < 0xf0) {
                                  local_144 = (stbi__gif_lzw)(1 << bVar4);
                                  if (0xf < bVar27) {
                                    if ((int)sVar37 < (int)uVar58) {
                                      stbi__grow_buffer_unsafe((stbi__jpeg *)local_4888);
                                      sVar37 = local_168._4_4_;
                                      sVar47 = local_168._0_4_;
                                    }
                                    uVar48 = (int)sVar47 << bVar4 | (uint)sVar47 >> 0x20 - bVar4;
                                    local_144 = (stbi__gif_lzw)
                                                ((int)local_144 + (uVar48 & stbi__bmask[uVar58]));
                                    local_168._4_4_ = (stbi__gif_lzw)((int)sVar37 - uVar58);
                                    local_168._0_4_ = (stbi__gif_lzw)(~stbi__bmask[uVar58] & uVar48)
                                    ;
                                  }
                                  goto LAB_0010c91f;
                                }
                                uVar48 = iVar30 + 0x10;
                              }
                              else {
                                lVar52 = (long)iVar30 + (ulong)uVar58;
                                bVar27 = ""[lVar52];
                                if ((int)sVar37 < (int)uVar48) {
                                  stbi__grow_buffer_unsafe((stbi__jpeg *)local_4888);
                                  sVar37 = local_168._4_4_;
                                  sVar47 = local_168._0_4_;
                                }
                                uVar50 = (int)sVar47 << (sbyte)uVar48 |
                                         (uint)sVar47 >> 0x20 - (sbyte)uVar48;
                                uVar58 = *(uint *)((long)stbi__bmask + (ulong)(uVar48 * 4));
                                sVar37 = (stbi__gif_lzw)((int)sVar37 - uVar48);
                                local_168._4_4_ = sVar37;
                                local_168._0_4_ = (stbi__gif_lzw)(~uVar58 & uVar50);
                                iVar30 = 0;
                                if (-1 < (int)sVar47) {
                                  iVar30 = *(int *)((long)stbi__jbias + (ulong)(uVar48 * 4));
                                }
                                uVar48 = (int)lVar52 + 1;
                                psVar43[bVar27] =
                                     (short)((uVar58 & uVar50) + iVar30 << (bVar9 & 0x1f));
                              }
                            }
                            else {
                              lVar52 = (long)iVar30 + (ulong)(uVar58 >> 4 & 0xf);
                              sVar37 = (stbi__gif_lzw)((int)local_168._4_4_ - (uVar58 & 0xf));
                              local_168._4_4_ = sVar37;
                              local_168._0_4_ =
                                   (stbi__gif_lzw)((int)local_168._0_4_ << (sbyte)(uVar58 & 0xf));
                              uVar48 = (int)lVar52 + 1;
                              psVar43[""[lVar52]] = (short)((uVar58 >> 8) << (bVar9 & 0x1f));
                            }
                            uVar54 = (ulong)uVar48;
                          } while ((int)uVar48 <= (int)local_150);
                        }
                        else {
LAB_0010c91f:
                          local_144 = (stbi__gif_lzw)((int)local_144 - 1);
                        }
                      }
                      else if (local_144 == (stbi__gif_lzw)0x0) {
                        iVar30 = 0x10000 << (bVar9 & 0x1f);
                        sVar37 = local_168._4_4_;
                        do {
                          if ((int)sVar37 < 0x10) {
                            stbi__grow_buffer_unsafe((stbi__jpeg *)local_4888);
                          }
                          uVar18 = (ulong)local_2e40[lVar34].fast[(uint)local_168._0_4_ >> 0x17];
                          if (uVar18 == 0xff) {
                            lVar52 = 0;
                            do {
                              lVar53 = lVar52;
                              lVar52 = lVar53 + 1;
                            } while (local_2e40[lVar34].maxcode[lVar53 + 10] <=
                                     (uint)local_168._0_4_ >> 0x10);
                            if (lVar52 == 8) goto LAB_0010eb2a;
                            if ((int)local_168._4_4_ < (int)(lVar53 + 10)) goto LAB_0010eb34;
                            uVar58 = (uint)local_168._0_4_ >> (0x17U - (char)lVar52 & 0x1f);
                            sVar47 = (stbi__gif_lzw)
                                     ((int)local_168._0_4_ << ((byte)(lVar53 + 10) & 0x1f));
                            sVar37 = (stbi__gif_lzw)(((int)local_168._4_4_ - (int)lVar52) + -9);
                            local_168._4_4_ = sVar37;
                            local_168._0_4_ = sVar47;
                            uVar18 = (ulong)(int)((uVar58 & stbi__bmask[lVar53 + 10]) +
                                                 local_2e40[lVar34].delta[lVar53 + 10]);
                          }
                          else {
                            bVar27 = local_2e40[lVar34].size[uVar18];
                            sVar37 = (stbi__gif_lzw)((int)local_168._4_4_ - (uint)bVar27);
                            if ((int)local_168._4_4_ < (int)(uint)bVar27) goto LAB_0010eb34;
                            sVar47 = (stbi__gif_lzw)((int)local_168._0_4_ << (bVar27 & 0x1f));
                            local_168._4_4_ = sVar37;
                            local_168._0_4_ = sVar47;
                          }
                          bVar27 = local_2e40[lVar34].values[uVar18];
                          bVar4 = bVar27 >> 4;
                          uVar58 = (uint)bVar4;
                          uVar18 = (ulong)uVar58;
                          if ((bVar27 & 0xf) == 1) {
                            sVar49 = sVar47;
                            if ((int)sVar37 < 1) {
                              stbi__grow_buffer_unsafe((stbi__jpeg *)local_4888);
                              sVar37 = local_168._4_4_;
                              sVar49 = local_168._0_4_;
                            }
                            sVar47 = (stbi__gif_lzw)((int)sVar49 * 2);
                            sVar37 = (stbi__gif_lzw)((int)sVar37 + -1);
                            sVar29 = (short)(((int)~(uint)sVar49 >> 0x1f | 1U) << (bVar9 & 0x1f));
                            local_168._4_4_ = sVar37;
                            local_168._0_4_ = sVar47;
                          }
                          else {
                            if ((bVar27 & 0xf) != 0) goto LAB_0010eb34;
                            if (bVar27 < 0xf0) {
                              local_144 = (stbi__gif_lzw)~(-1 << bVar4);
                              uVar59 = 0x40;
                              if (0xf < bVar27) {
                                if ((int)sVar37 < (int)uVar58) {
                                  stbi__grow_buffer_unsafe((stbi__jpeg *)local_4888);
                                  sVar37 = local_168._4_4_;
                                  sVar47 = local_168._0_4_;
                                }
                                uVar48 = (int)sVar47 << bVar4 | (uint)sVar47 >> 0x20 - bVar4;
                                sVar47 = (stbi__gif_lzw)(~stbi__bmask[uVar18] & uVar48);
                                sVar37 = (stbi__gif_lzw)((int)sVar37 - uVar58);
                                local_168._4_4_ = sVar37;
                                local_168._0_4_ = sVar47;
                                local_144 = (stbi__gif_lzw)
                                            ((uVar48 & stbi__bmask[uVar18]) + (int)local_144);
                                sVar29 = 0;
                                uVar18 = uVar59;
                                goto LAB_0010cb0f;
                              }
                            }
                            else {
                              uVar59 = 0xf;
                            }
                            sVar29 = 0;
                            uVar18 = uVar59;
                          }
LAB_0010cb0f:
                          uVar59 = (ulong)(uint)local_150;
                          sVar49 = local_150;
                          if ((int)uVar54 <= (int)local_150) {
                            uVar45 = (long)(int)uVar54;
                            do {
                              bVar27 = ""[uVar45];
                              if (psVar43[bVar27] == 0) {
                                if ((int)uVar18 == 0) {
                                  uVar54 = (ulong)((int)uVar45 + 1);
                                  psVar43[bVar27] = sVar29;
                                  sVar49 = SUB84(uVar59,0);
                                  break;
                                }
                                uVar18 = (ulong)((int)uVar18 - 1);
                              }
                              else {
                                sVar49 = sVar47;
                                if ((int)sVar37 < 1) {
                                  stbi__grow_buffer_unsafe((stbi__jpeg *)local_4888);
                                  sVar37 = local_168._4_4_;
                                  sVar49 = local_168._0_4_;
                                }
                                sVar47 = (stbi__gif_lzw)((int)sVar49 * 2);
                                sVar37 = (stbi__gif_lzw)((int)sVar37 + -1);
                                local_168._4_4_ = sVar37;
                                local_168._0_4_ = sVar47;
                                if (((int)sVar49 < 0) &&
                                   (sVar1 = psVar43[bVar27], (iVar30 >> 0x10 & (int)sVar1) == 0)) {
                                  sVar5 = (short)((uint)iVar30 >> 0x10);
                                  if (sVar1 < 1) {
                                    sVar5 = -sVar5;
                                  }
                                  psVar43[bVar27] = sVar1 + sVar5;
                                }
                              }
                              uVar54 = uVar45 + 1;
                              uVar59 = (ulong)(int)local_150;
                              bVar61 = (long)uVar45 < (long)uVar59;
                              uVar45 = uVar54;
                              sVar49 = local_150;
                            } while (bVar61);
                          }
                        } while ((int)uVar54 <= (int)sVar49);
                      }
                      else {
                        local_144 = (stbi__gif_lzw)((int)local_144 - 1);
                        if ((int)local_154 <= (int)local_150) {
                          uVar58 = (0x10000 << (bVar9 & 0x1f)) >> 0x10;
                          do {
                            bVar9 = ""[uVar54];
                            if (psVar43[bVar9] != 0) {
                              if ((int)local_168._4_4_ < 1) {
                                stbi__grow_buffer_unsafe((stbi__jpeg *)local_4888);
                              }
                              sVar37 = local_168._0_4_;
                              local_168._4_4_ = (stbi__gif_lzw)((int)local_168._4_4_ + -1);
                              local_168._0_4_ = (stbi__gif_lzw)((int)local_168._0_4_ * 2);
                              if (((int)sVar37 < 0) &&
                                 (sVar29 = psVar43[bVar9], (uVar58 & (int)sVar29) == 0)) {
                                uVar48 = -uVar58;
                                if (0 < sVar29) {
                                  uVar48 = uVar58;
                                }
                                psVar43[bVar9] = (short)uVar48 + sVar29;
                              }
                            }
                            bVar61 = (long)uVar54 < (long)(int)local_150;
                            uVar54 = uVar54 + 1;
                          } while (bVar61);
                        }
                      }
                    }
                    sVar37 = local_128;
                    local_128 = (stbi__gif_lzw)((int)local_128 + -1);
                    if ((int)sVar37 < 2) {
                      if ((int)local_168._4_4_ < 0x18) {
                        stbi__grow_buffer_unsafe((stbi__jpeg *)local_4888);
                      }
                      if ((local_160 & 0xf8) != 0xd0) goto LAB_0010d4ef;
                      local_168._0_2_ = 0;
                      local_168._2_1_ = '\0';
                      local_168._3_1_ = '\0';
                      local_168._4_2_ = 0;
                      local_168._6_1_ = '\0';
                      local_168._7_1_ = '\0';
                      local_15c.prefix = 0;
                      local_15c.first = '\0';
                      local_15c.suffix = '\0';
                      local_210.prefix = 0;
                      local_210.first = '\0';
                      local_210.suffix = '\0';
                      local_270.prefix = 0;
                      local_270.first = '\0';
                      local_270.suffix = '\0';
                      local_2d0.prefix = 0;
                      local_2d0.first = '\0';
                      local_2d0.suffix = '\0';
                      local_160 = 0xff;
                      local_128 = local_12c;
                      if (local_12c == (stbi__gif_lzw)0x0) {
                        local_128.prefix = -1;
                        local_128.first = 0xff;
                        local_128.suffix = '\x7f';
                      }
                      local_144.prefix = 0;
                      local_144.first = '\0';
                      local_144.suffix = '\0';
                    }
                    iVar38 = iVar38 + 1;
                  } while (iVar38 != iVar56);
                }
                local_4a14 = local_4a14 + 1;
              } while (local_4a14 != iVar10);
            }
          }
          else if (0 < (int)local_2f4) {
            iVar10 = 0;
            sVar39 = local_2f4;
            sVar47 = local_2f8;
            do {
              if (0 < (int)sVar47) {
                iVar56 = 0;
                do {
                  if (0 < (int)local_140) {
                    lVar44 = 0;
                    sVar39 = local_140;
                    do {
                      sVar37 = local_13c[lVar44];
                      lVar34 = (long)(int)sVar37;
                      uVar58 = auStack_2e4[lVar34 * 0x18 + 1];
                      if (0 < (int)uVar58) {
                        uVar48 = auStack_2e4[lVar34 * 0x18];
                        iVar38 = 0;
                        do {
                          if (0 < (int)uVar48) {
                            iVar30 = 0;
                            do {
                              iVar11 = stbi__jpeg_decode_block_prog_dc
                                                 ((stbi__jpeg *)local_4888,
                                                  (short *)((long)(int)((uVar48 * iVar56 + iVar30 +
                                                                        (auStack_2e4
                                                                         [lVar34 * 0x18 + 1] *
                                                                         iVar10 + iVar38) *
                                                                        local_290[lVar34 * 0x18]) *
                                                                       0x40) * 2 +
                                                           alStack_2a0[lVar34 * 0xc + 1]),
                                                  (stbi__huffman *)
                                                  (local_4888 +
                                                  (long)(int)auStack_2e4[lVar34 * 0x18 + 3] * 0x690
                                                  + 8),(int)sVar37);
                              if (iVar11 == 0) goto LAB_0010e0cf;
                              iVar30 = iVar30 + 1;
                              uVar48 = auStack_2e4[lVar34 * 0x18];
                            } while (iVar30 < (int)uVar48);
                            uVar58 = auStack_2e4[lVar34 * 0x18 + 1];
                          }
                          iVar38 = iVar38 + 1;
                          sVar39 = local_140;
                        } while (iVar38 < (int)uVar58);
                      }
                      lVar44 = lVar44 + 1;
                      sVar37 = local_128;
                    } while (lVar44 < (int)sVar39);
                  }
                  local_128 = (stbi__gif_lzw)((int)sVar37 + -1);
                  if ((int)sVar37 < 2) {
                    if ((int)local_168._4_4_ < 0x18) {
                      stbi__grow_buffer_unsafe((stbi__jpeg *)local_4888);
                    }
                    if ((local_160 & 0xf8) != 0xd0) goto LAB_0010d4ef;
                    local_168._0_2_ = 0;
                    local_168._2_1_ = '\0';
                    local_168._3_1_ = '\0';
                    local_168._4_2_ = 0;
                    local_168._6_1_ = '\0';
                    local_168._7_1_ = '\0';
                    local_15c.prefix = 0;
                    local_15c.first = '\0';
                    local_15c.suffix = '\0';
                    local_210.prefix = 0;
                    local_210.first = '\0';
                    local_210.suffix = '\0';
                    local_270.prefix = 0;
                    local_270.first = '\0';
                    local_270.suffix = '\0';
                    local_2d0.prefix = 0;
                    local_2d0.first = '\0';
                    local_2d0.suffix = '\0';
                    local_160 = 0xff;
                    local_128 = local_12c;
                    if (local_12c == (stbi__gif_lzw)0x0) {
                      local_128.prefix = -1;
                      local_128.first = 0xff;
                      local_128.suffix = '\x7f';
                    }
                    local_144.prefix = 0;
                    local_144.first = '\0';
                    local_144.suffix = '\0';
                  }
                  iVar56 = iVar56 + 1;
                  sVar39 = local_2f4;
                  sVar47 = local_2f8;
                  sVar37 = local_128;
                } while (iVar56 < (int)local_2f8);
              }
              iVar10 = iVar10 + 1;
            } while (iVar10 < (int)sVar39);
          }
          goto LAB_0010d4ef;
        }
        stbi__g_failure_reason = "bad SOS len";
      }
      else {
        if (*(int *)(local_4888._0_8_ + 0x30) != 0) {
          psVar23 = (stbi_uc *)(local_4888._0_8_ + 0x38);
          iVar56 = (*((stbi_io_callbacks *)(local_4888._0_8_ + 0x10))->read)
                             (*(void **)(local_4888._0_8_ + 0x28),(char *)psVar23,
                              *(int *)(local_4888._0_8_ + 0x34));
          if (iVar56 == 0) {
            *(int *)(uVar3 + 0x30) = 0;
            psVar33 = (stbi_uc *)(uVar3 + 0x38) + 1;
            *(stbi_uc *)(uVar3 + 0x38) = '\0';
            bVar9 = 0;
          }
          else {
            psVar33 = psVar23 + iVar56;
            bVar9 = *psVar23;
          }
          *(stbi_uc **)(uVar3 + 0xc0) = psVar33;
          *(stbi_uc **)(uVar3 + 0xb8) = (stbi_uc *)(uVar3 + 0x38) + 1;
          goto LAB_0010c331;
        }
        local_140.prefix = 0;
        local_140.first = '\0';
        local_140.suffix = '\0';
LAB_0010e0c1:
        stbi__g_failure_reason = "bad SOS component count";
      }
      goto LAB_0010e0cf;
    }
LAB_0010d68f:
    stbi__g_failure_reason = "bad req_comp";
    return (uchar *)0x0;
  }
  stbi__g_failure_reason = "no SOI";
  s->img_buffer = s->img_buffer_original;
  iVar10 = stbi__check_png_header(s);
  psVar23 = s->img_buffer_original;
  s->img_buffer = psVar23;
  if (iVar10 != 0) {
    if ((uint)req_comp < 5) {
      puVar55 = (uchar *)0x0;
      local_4888._0_8_ = s;
      iVar10 = stbi__parse_png_file((stbi__png *)local_4888,0,req_comp);
      uVar3 = local_4888._0_8_;
      puVar21 = (uchar *)CONCAT44(uStack_486c,local_4870);
      if (iVar10 != 0) {
        puVar55 = puVar21;
        if ((req_comp != 0) && (*(int *)(local_4888._0_8_ + 0xc) != req_comp)) {
          puVar55 = stbi__convert_format
                              (puVar21,*(int *)(local_4888._0_8_ + 0xc),req_comp,
                               *(stbi__uint32 *)local_4888._0_8_,
                               *(stbi__uint32 *)(local_4888._0_8_ + 4));
          *(int *)(uVar3 + 0xc) = req_comp;
          if (puVar55 == (uchar *)0x0) {
            return (uchar *)0x0;
          }
        }
        *x = *(stbi__uint32 *)uVar3;
        *y = *(stbi__uint32 *)(uVar3 + 4);
        if (comp != (int *)0x0) {
          *comp = *(int *)(uVar3 + 0xc);
        }
        puVar21 = (uchar *)0x0;
      }
      free(puVar21);
      free((void *)CONCAT44(iStack_4874,local_4878));
      free((void *)local_4888._8_8_);
      return puVar55;
    }
    goto LAB_0010d68f;
  }
  psVar33 = s->img_buffer_end;
  if (psVar23 < psVar33) {
    psVar24 = psVar23 + 1;
    s->img_buffer = psVar24;
    sVar8 = *psVar23;
LAB_0010d7c2:
    if (sVar8 != 'B') goto LAB_0010d8dd;
    if (psVar24 < psVar33) {
      s->img_buffer = psVar24 + 1;
      sVar8 = *psVar24;
    }
    else {
      if (s->read_from_callbacks == 0) goto LAB_0010d8dd;
      psVar23 = s->buffer_start;
      iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar23,s->buflen);
      if (iVar10 == 0) {
        s->read_from_callbacks = 0;
        psVar33 = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
        sVar8 = '\0';
      }
      else {
        psVar33 = psVar23 + iVar10;
        sVar8 = *psVar23;
      }
      s->img_buffer_end = psVar33;
      s->img_buffer = s->buffer_start + 1;
    }
    if (sVar8 != 'M') goto LAB_0010d8dd;
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    uVar58 = stbi__get16le(s);
    iVar10 = stbi__get16le(s);
    uVar58 = iVar10 << 0x10 | uVar58;
    if (((uVar58 < 0x39) && ((0x100010000001000U >> ((ulong)uVar58 & 0x3f) & 1) != 0)) ||
       (uVar58 == 0x6c)) {
      psVar23 = s->img_buffer_original;
      s->img_buffer = psVar23;
LAB_0010d8b9:
      psVar33 = s->img_buffer_end;
      if (psVar23 < psVar33) {
        psVar24 = psVar23 + 1;
        s->img_buffer = psVar24;
        sVar8 = *psVar23;
      }
      else {
        if (s->read_from_callbacks == 0) goto LAB_0010e1c1;
        psVar23 = s->buffer_start;
        iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar23,s->buflen);
        if (iVar10 == 0) {
          s->read_from_callbacks = 0;
          psVar33 = s->buffer_start + 1;
          s->buffer_start[0] = '\0';
          sVar8 = '\0';
        }
        else {
          psVar33 = psVar23 + iVar10;
          sVar8 = *psVar23;
        }
        s->img_buffer_end = psVar33;
        psVar24 = s->buffer_start + 1;
        s->img_buffer = psVar24;
      }
      if (sVar8 != 'B') {
LAB_0010e1c1:
        stbi__g_failure_reason = "not BMP";
        return (uchar *)0x0;
      }
      if (psVar24 < psVar33) {
        s->img_buffer = psVar24 + 1;
        sVar8 = *psVar24;
      }
      else {
        if (s->read_from_callbacks == 0) goto LAB_0010e1c1;
        psVar23 = s->buffer_start;
        iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar23,s->buflen);
        if (iVar10 == 0) {
          s->read_from_callbacks = 0;
          psVar33 = s->buffer_start + 1;
          s->buffer_start[0] = '\0';
          sVar8 = '\0';
        }
        else {
          psVar33 = psVar23 + iVar10;
          sVar8 = *psVar23;
        }
        s->img_buffer_end = psVar33;
        s->img_buffer = s->buffer_start + 1;
      }
      if (sVar8 != 'M') goto LAB_0010e1c1;
      stbi__get16le(s);
      stbi__get16le(s);
      stbi__get16le(s);
      stbi__get16le(s);
      uVar58 = stbi__get16le(s);
      iVar10 = stbi__get16le(s);
      uVar48 = stbi__get16le(s);
      iVar56 = stbi__get16le(s);
      uVar48 = iVar56 << 0x10 | uVar48;
      if (((0x38 < uVar48) || ((0x100010000001000U >> ((ulong)uVar48 & 0x3f) & 1) == 0)) &&
         ((uVar48 != 0x6c && (uVar48 != 0x7c)))) {
        stbi__g_failure_reason = "unknown BMP";
        return (uchar *)0x0;
      }
      uVar50 = stbi__get16le(s);
      if (uVar48 == 0xc) {
        s->img_x = uVar50;
        uVar50 = stbi__get16le(s);
      }
      else {
        iVar56 = stbi__get16le(s);
        s->img_x = iVar56 << 0x10 | uVar50;
        uVar50 = stbi__get16le(s);
        iVar56 = stbi__get16le(s);
        uVar50 = iVar56 << 0x10 | uVar50;
      }
      s->img_y = uVar50;
      iVar56 = stbi__get16le(s);
      if (iVar56 != 1) goto LAB_0010f81a;
      uVar50 = stbi__get16le(s);
      if (uVar50 == 1) {
        stbi__g_failure_reason = "monochrome";
        return (uchar *)0x0;
      }
      uVar58 = iVar10 << 0x10 | uVar58;
      sVar2 = s->img_y;
      sVar31 = -sVar2;
      if (0 < (int)sVar2) {
        sVar31 = sVar2;
      }
      s->img_y = sVar31;
      if (uVar48 == 0xc) {
        sVar31 = 0;
        if (uVar50 < 0x18) {
          uVar54 = (ulong)(uint)((int)(uVar58 - 0x26) / 3);
        }
        else {
          uVar54 = 0;
        }
        local_4a14 = 0;
        uVar14 = 0;
        uVar13 = 0;
      }
      else {
        uVar41 = stbi__get16le(s);
        iVar10 = stbi__get16le(s);
        if ((iVar10 * 0x10000 + uVar41) - 1 < 2) {
          stbi__g_failure_reason = "BMP RLE";
          return (uchar *)0x0;
        }
        stbi__get32le(s);
        stbi__get32le(s);
        stbi__get32le(s);
        stbi__get32le(s);
        stbi__get32le(s);
        if (uVar48 == 0x28) {
LAB_0010ea91:
          if (uVar50 != 0x20) {
            sVar31 = 0;
            local_4a14 = 0;
            uVar14 = 0;
            uVar13 = 0;
            if (uVar50 != 0x10) goto LAB_0010ee96;
          }
          uVar41 = iVar10 * 0x10000 | uVar41;
          if (uVar41 == 3) {
            uVar13 = stbi__get32le(s);
            uVar14 = stbi__get32le(s);
            local_4a14 = stbi__get32le(s);
            if (uVar14 == local_4a14 && uVar13 == uVar14) goto LAB_0010f81a;
            sVar31 = 0;
          }
          else {
            if (uVar41 != 0) {
LAB_0010f81a:
              stbi__g_failure_reason = "bad BMP";
              return (uchar *)0x0;
            }
            bVar61 = uVar50 != 0x20;
            local_4a14 = 0x1f;
            if (!bVar61) {
              local_4a14 = 0xff;
            }
            uVar14 = 0x3e0;
            if (!bVar61) {
              uVar14 = 0xff00;
            }
            uVar13 = 0x7c00;
            if (!bVar61) {
              uVar13 = 0xff0000;
            }
            sVar31 = (uint)bVar61 * 0x1000000 - 0x1000000;
          }
          uVar54 = 0;
        }
        else {
          if (uVar48 == 0x38) {
            stbi__get32le(s);
            stbi__get32le(s);
            stbi__get32le(s);
            stbi__get32le(s);
            goto LAB_0010ea91;
          }
          uVar13 = stbi__get32le(s);
          uVar14 = stbi__get32le(s);
          local_4a14 = stbi__get32le(s);
          sVar31 = stbi__get32le(s);
          stbi__get32le(s);
          iVar10 = 0xc;
          do {
            stbi__get16le(s);
            stbi__get16le(s);
            iVar10 = iVar10 + -1;
          } while (iVar10 != 0);
          if (uVar48 == 0x7c) {
            stbi__get32le(s);
            stbi__get32le(s);
            stbi__get32le(s);
            stbi__get32le(s);
          }
LAB_0010ee96:
          if (uVar50 < 0x10) {
            uVar54 = (ulong)(uint)((int)((uVar58 - uVar48) + -0xe) >> 2);
          }
          else {
            uVar54 = 0;
          }
        }
      }
      iVar10 = 4 - (uint)(sVar31 == 0);
      s->img_n = iVar10;
      if (2 < req_comp) {
        iVar10 = req_comp;
      }
      puVar21 = (uchar *)malloc((ulong)(s->img_x * iVar10 * s->img_y));
      if (puVar21 == (uchar *)0x0) {
LAB_0010e0aa:
        stbi__g_failure_reason = "outofmem";
        return (uchar *)0x0;
      }
      if (uVar50 < 0x10) {
        iVar56 = (int)uVar54;
        if (0x100 < iVar56 || iVar56 == 0) {
          free(puVar21);
          stbi__g_failure_reason = "invalid";
          return (uchar *)0x0;
        }
        if (0 < iVar56) {
          psVar23 = s->buffer_start;
          psVar33 = s->buffer_start + 1;
          psVar24 = s->img_buffer;
          psVar25 = s->img_buffer_end;
          uVar18 = 0;
          do {
            if (psVar24 < psVar25) {
              s->img_buffer = psVar24 + 1;
              sVar8 = *psVar24;
              psVar24 = psVar24 + 1;
            }
            else if (s->read_from_callbacks == 0) {
              sVar8 = '\0';
            }
            else {
              iVar38 = (*(s->io).read)(s->io_user_data,(char *)psVar23,s->buflen);
              if (iVar38 == 0) {
                s->read_from_callbacks = 0;
                s->buffer_start[0] = '\0';
                sVar8 = '\0';
                psVar25 = psVar33;
              }
              else {
                sVar8 = *psVar23;
                psVar25 = psVar23 + iVar38;
              }
              s->img_buffer_end = psVar25;
              s->img_buffer = psVar33;
              psVar24 = psVar33;
            }
            local_4888[uVar18 * 4 + 2] = sVar8;
            if (psVar24 < psVar25) {
              s->img_buffer = psVar24 + 1;
              sVar8 = *psVar24;
              psVar24 = psVar24 + 1;
            }
            else if (s->read_from_callbacks == 0) {
              sVar8 = '\0';
            }
            else {
              iVar38 = (*(s->io).read)(s->io_user_data,(char *)psVar23,s->buflen);
              if (iVar38 == 0) {
                s->read_from_callbacks = 0;
                s->buffer_start[0] = '\0';
                sVar8 = '\0';
                psVar25 = psVar33;
              }
              else {
                sVar8 = *psVar23;
                psVar25 = psVar23 + iVar38;
              }
              s->img_buffer_end = psVar25;
              s->img_buffer = psVar33;
              psVar24 = psVar33;
            }
            local_4888[uVar18 * 4 + 1] = sVar8;
            if (psVar24 < psVar25) {
              s->img_buffer = psVar24 + 1;
              sVar8 = *psVar24;
              psVar24 = psVar24 + 1;
            }
            else if (s->read_from_callbacks == 0) {
              sVar8 = '\0';
            }
            else {
              iVar38 = (*(s->io).read)(s->io_user_data,(char *)psVar23,s->buflen);
              if (iVar38 == 0) {
                s->read_from_callbacks = 0;
                s->buffer_start[0] = '\0';
                sVar8 = '\0';
                psVar25 = psVar33;
              }
              else {
                sVar8 = *psVar23;
                psVar25 = psVar23 + iVar38;
              }
              s->img_buffer_end = psVar25;
              s->img_buffer = psVar33;
              psVar24 = psVar33;
            }
            local_4888[uVar18 * 4] = sVar8;
            if (uVar48 != 0xc) {
              if (psVar24 < psVar25) {
                psVar24 = psVar24 + 1;
              }
              else {
                if (s->read_from_callbacks == 0) goto LAB_0010edbb;
                iVar38 = (*(s->io).read)(s->io_user_data,(char *)psVar23,s->buflen);
                if (iVar38 == 0) {
                  s->read_from_callbacks = 0;
                  s->buffer_start[0] = '\0';
                  psVar25 = psVar33;
                }
                else {
                  psVar25 = psVar23 + iVar38;
                }
                s->img_buffer_end = psVar25;
                psVar24 = psVar33;
              }
              s->img_buffer = psVar24;
            }
LAB_0010edbb:
            local_4888[uVar18 * 4 + 3] = 0xff;
            uVar18 = uVar18 + 1;
          } while (uVar54 != uVar18);
        }
        stbi__skip(s,(uVar58 - uVar48) + iVar56 * (uVar48 == 0xc | 0xfffffffc) + -0xe);
        if (uVar50 == 4) {
          uVar58 = s->img_x + 1 >> 1;
        }
        else {
          if (uVar50 != 8) {
            free(puVar21);
            stbi__g_failure_reason = "bad bpp";
            return (uchar *)0x0;
          }
          uVar58 = s->img_x;
        }
        y_00 = s->img_y;
        if (0 < (int)y_00) {
          psVar23 = s->buffer_start;
          psVar33 = s->buffer_start + 1;
          uVar54 = 0;
          iVar56 = 0;
          do {
            if (0 < (int)s->img_x) {
              psVar24 = s->img_buffer;
              psVar25 = s->img_buffer_end;
              iVar38 = 0;
              do {
                if (psVar24 < psVar25) {
                  s->img_buffer = psVar24 + 1;
                  bVar9 = *psVar24;
                  psVar24 = psVar24 + 1;
                }
                else if (s->read_from_callbacks == 0) {
                  bVar9 = 0;
                }
                else {
                  iVar30 = (*(s->io).read)(s->io_user_data,(char *)psVar23,s->buflen);
                  if (iVar30 == 0) {
                    s->read_from_callbacks = 0;
                    s->buffer_start[0] = '\0';
                    bVar9 = 0;
                    psVar25 = psVar33;
                  }
                  else {
                    bVar9 = *psVar23;
                    psVar25 = psVar23 + iVar30;
                  }
                  s->img_buffer_end = psVar25;
                  s->img_buffer = psVar33;
                  psVar24 = psVar33;
                }
                uVar41 = bVar9 & 0xf;
                uVar48 = (uint)(bVar9 >> 4);
                if (uVar50 != 4) {
                  uVar48 = (uint)bVar9;
                }
                uVar18 = (ulong)uVar48;
                if (uVar50 != 4) {
                  uVar41 = 0;
                }
                lVar44 = (long)(int)uVar54;
                uVar59 = lVar44 + 3;
                puVar21[lVar44] = local_4888[uVar18 * 4];
                puVar21[lVar44 + 1] = local_4888[uVar18 * 4 + 1];
                puVar21[lVar44 + 2] = local_4888[uVar18 * 4 + 2];
                if (iVar10 == 4) {
                  puVar21[lVar44 + 3] = 0xff;
                  uVar59 = (ulong)((int)uVar54 + 4);
                }
                if (iVar38 + 1U == s->img_x) {
                  uVar54 = uVar59 & 0xffffffff;
                  break;
                }
                if (uVar50 == 8) {
                  if (psVar24 < psVar25) {
                    s->img_buffer = psVar24 + 1;
                    bVar9 = *psVar24;
                    psVar24 = psVar24 + 1;
                  }
                  else if (s->read_from_callbacks == 0) {
                    bVar9 = 0;
                  }
                  else {
                    iVar30 = (*(s->io).read)(s->io_user_data,(char *)psVar23,s->buflen);
                    if (iVar30 == 0) {
                      s->read_from_callbacks = 0;
                      s->buffer_start[0] = '\0';
                      bVar9 = 0;
                      psVar25 = psVar33;
                    }
                    else {
                      bVar9 = *psVar23;
                      psVar25 = psVar23 + iVar30;
                    }
                    s->img_buffer_end = psVar25;
                    s->img_buffer = psVar33;
                    psVar24 = psVar33;
                  }
                  uVar41 = (uint)bVar9;
                }
                lVar44 = (long)(int)uVar59;
                uVar54 = lVar44 + 3;
                uVar18 = (ulong)uVar41;
                puVar21[lVar44] = local_4888[uVar18 * 4];
                puVar21[lVar44 + 1] = local_4888[uVar18 * 4 + 1];
                puVar21[lVar44 + 2] = local_4888[uVar18 * 4 + 2];
                if (iVar10 == 4) {
                  puVar21[lVar44 + 3] = 0xff;
                  uVar54 = (ulong)((int)uVar59 + 4);
                }
                iVar38 = iVar38 + 2;
              } while (iVar38 < (int)s->img_x);
            }
            stbi__skip(s,-uVar58 & 3);
            iVar56 = iVar56 + 1;
            y_00 = s->img_y;
          } while (iVar56 < (int)y_00);
        }
        goto LAB_0010f70c;
      }
      stbi__skip(s,(uVar58 - uVar48) + -0xe);
      if (uVar50 == 0x20) {
        local_49ac = 0;
        if (((sVar31 != 0xff000000) || (local_4a14 != 0xff)) ||
           ((uVar14 != 0xff00 || (uVar13 != 0xff0000)))) goto LAB_0010ef5a;
        bVar61 = true;
LAB_0010ef0c:
        bVar6 = false;
        iVar56 = 0;
        local_49e4 = 0;
        local_49c4 = 0;
        local_49a8 = 0;
        local_4990 = 0;
        local_49a4 = 0;
        uVar58 = 0;
        uVar48 = 0;
      }
      else {
        if (uVar50 == 0x18) {
          local_49ac = s->img_x & 3;
          bVar61 = false;
          goto LAB_0010ef0c;
        }
        local_49ac = 0;
        if (uVar50 == 0x10) {
          local_49ac = s->img_x * 2 & 2;
        }
LAB_0010ef5a:
        if (((local_4a14 == 0) || (uVar14 == 0)) || (uVar13 == 0)) {
          free(puVar21);
          stbi__g_failure_reason = "bad masks";
          return (uchar *)0x0;
        }
        iVar56 = stbi__high_bit(uVar13);
        iVar56 = iVar56 + -7;
        local_4990 = stbi__bitcount(uVar13);
        local_49e4 = stbi__high_bit(uVar14);
        local_49e4 = local_49e4 + -7;
        local_49a4 = stbi__bitcount(uVar14);
        local_49c4 = stbi__high_bit(local_4a14);
        local_49c4 = local_49c4 + -7;
        uVar58 = stbi__bitcount(local_4a14);
        local_49a8 = stbi__high_bit(sVar31);
        local_49a8 = local_49a8 + -7;
        uVar48 = stbi__bitcount(sVar31);
        bVar6 = true;
        bVar61 = false;
      }
      y_00 = s->img_y;
      if (0 < (int)y_00) {
        psVar23 = s->buffer_start;
        psVar33 = s->buffer_start + 1;
        iVar30 = 0;
        iVar38 = 0;
        do {
          if (bVar6) {
            if (0 < (int)s->img_x) {
              iVar11 = 0;
              do {
                uVar41 = stbi__get16le(s);
                if (uVar50 != 0x10) {
                  iVar12 = stbi__get16le(s);
                  uVar41 = uVar41 | iVar12 << 0x10;
                }
                iVar12 = (int)(uVar41 & uVar13) >> ((byte)iVar56 & 0x1f);
                if (iVar56 < 0) {
                  iVar12 = (uVar41 & uVar13) << (-(byte)iVar56 & 0x1f);
                }
                uVar32 = local_4990;
                iVar40 = iVar12;
                if (local_4990 < 8) {
                  do {
                    iVar40 = iVar40 + (iVar12 >> ((byte)uVar32 & 0x1f));
                    uVar36 = (uchar)iVar40;
                    uVar32 = uVar32 + local_4990;
                  } while (uVar32 < 8);
                }
                else {
                  uVar36 = (uchar)iVar12;
                }
                iVar12 = (int)(uVar41 & uVar14) >> ((byte)local_49e4 & 0x1f);
                if (local_49e4 < 0) {
                  iVar12 = (uVar41 & uVar14) << (-(byte)local_49e4 & 0x1f);
                }
                puVar21[iVar30] = uVar36;
                iVar40 = iVar12;
                uVar32 = local_49a4;
                if (local_49a4 < 8) {
                  do {
                    iVar40 = iVar40 + (iVar12 >> ((byte)uVar32 & 0x1f));
                    uVar36 = (uchar)iVar40;
                    uVar32 = uVar32 + local_49a4;
                  } while (uVar32 < 8);
                }
                else {
                  uVar36 = (uchar)iVar12;
                }
                iVar12 = (int)(uVar41 & local_4a14) >> ((byte)local_49c4 & 0x1f);
                if (local_49c4 < 0) {
                  iVar12 = (uVar41 & local_4a14) << (-(byte)local_49c4 & 0x1f);
                }
                puVar21[(long)iVar30 + 1] = uVar36;
                uVar32 = uVar58;
                iVar40 = iVar12;
                if (uVar58 < 8) {
                  do {
                    iVar40 = iVar40 + (iVar12 >> ((byte)uVar32 & 0x1f));
                    uVar36 = (uchar)iVar40;
                    uVar32 = uVar32 + uVar58;
                  } while (uVar32 < 8);
                }
                else {
                  uVar36 = (uchar)iVar12;
                }
                puVar21[(long)iVar30 + 2] = uVar36;
                if (sVar31 == 0) {
                  uVar36 = 0xff;
                }
                else {
                  iVar12 = (int)(uVar41 & sVar31) >> ((byte)local_49a8 & 0x1f);
                  if (local_49a8 < 0) {
                    iVar12 = (uVar41 & sVar31) << (-(byte)local_49a8 & 0x1f);
                  }
                  uVar41 = uVar48;
                  iVar40 = iVar12;
                  if (uVar48 < 8) {
                    do {
                      iVar40 = iVar40 + (iVar12 >> ((byte)uVar41 & 0x1f));
                      uVar36 = (uchar)iVar40;
                      uVar41 = uVar41 + uVar48;
                    } while (uVar41 < 8);
                  }
                  else {
                    uVar36 = (uchar)iVar12;
                  }
                }
                iVar12 = iVar30 + 3;
                if (iVar10 == 4) {
                  puVar21[(long)iVar30 + 3] = uVar36;
                  iVar12 = iVar30 + 4;
                }
                iVar30 = iVar12;
                iVar11 = iVar11 + 1;
              } while (iVar11 < (int)s->img_x);
            }
          }
          else if (0 < (int)s->img_x) {
            psVar24 = s->img_buffer;
            psVar25 = s->img_buffer_end;
            iVar11 = 0;
            do {
              if (psVar24 < psVar25) {
                s->img_buffer = psVar24 + 1;
                uVar36 = *psVar24;
                psVar24 = psVar24 + 1;
              }
              else if (s->read_from_callbacks == 0) {
                uVar36 = '\0';
              }
              else {
                iVar12 = (*(s->io).read)(s->io_user_data,(char *)psVar23,s->buflen);
                if (iVar12 == 0) {
                  s->read_from_callbacks = 0;
                  s->buffer_start[0] = '\0';
                  uVar36 = '\0';
                  psVar25 = psVar33;
                }
                else {
                  uVar36 = *psVar23;
                  psVar25 = psVar23 + iVar12;
                }
                s->img_buffer_end = psVar25;
                s->img_buffer = psVar33;
                psVar24 = psVar33;
              }
              puVar21[(long)iVar30 + 2] = uVar36;
              if (psVar24 < psVar25) {
                s->img_buffer = psVar24 + 1;
                uVar36 = *psVar24;
                psVar24 = psVar24 + 1;
              }
              else if (s->read_from_callbacks == 0) {
                uVar36 = '\0';
              }
              else {
                iVar12 = (*(s->io).read)(s->io_user_data,(char *)psVar23,s->buflen);
                if (iVar12 == 0) {
                  s->read_from_callbacks = 0;
                  s->buffer_start[0] = '\0';
                  uVar36 = '\0';
                  psVar25 = psVar33;
                }
                else {
                  uVar36 = *psVar23;
                  psVar25 = psVar23 + iVar12;
                }
                s->img_buffer_end = psVar25;
                s->img_buffer = psVar33;
                psVar24 = psVar33;
              }
              puVar21[(long)iVar30 + 1] = uVar36;
              if (psVar24 < psVar25) {
                s->img_buffer = psVar24 + 1;
                uVar36 = *psVar24;
                psVar24 = psVar24 + 1;
              }
              else if (s->read_from_callbacks == 0) {
                uVar36 = '\0';
              }
              else {
                iVar12 = (*(s->io).read)(s->io_user_data,(char *)psVar23,s->buflen);
                if (iVar12 == 0) {
                  s->read_from_callbacks = 0;
                  s->buffer_start[0] = '\0';
                  uVar36 = '\0';
                  psVar25 = psVar33;
                }
                else {
                  uVar36 = *psVar23;
                  psVar25 = psVar23 + iVar12;
                }
                s->img_buffer_end = psVar25;
                s->img_buffer = psVar33;
                psVar24 = psVar33;
              }
              puVar21[iVar30] = uVar36;
              uVar36 = 0xff;
              if (bVar61) {
                if (psVar24 < psVar25) {
                  s->img_buffer = psVar24 + 1;
                  uVar36 = *psVar24;
                  psVar24 = psVar24 + 1;
                }
                else if (s->read_from_callbacks == 0) {
                  uVar36 = '\0';
                }
                else {
                  iVar12 = (*(s->io).read)(s->io_user_data,(char *)psVar23,s->buflen);
                  if (iVar12 == 0) {
                    s->read_from_callbacks = 0;
                    s->buffer_start[0] = '\0';
                    uVar36 = '\0';
                    psVar25 = psVar33;
                  }
                  else {
                    uVar36 = *psVar23;
                    psVar25 = psVar23 + iVar12;
                  }
                  s->img_buffer_end = psVar25;
                  s->img_buffer = psVar33;
                  psVar24 = psVar33;
                }
              }
              iVar12 = iVar30 + 3;
              if (iVar10 == 4) {
                puVar21[(long)iVar30 + 3] = uVar36;
                iVar12 = iVar30 + 4;
              }
              iVar30 = iVar12;
              iVar11 = iVar11 + 1;
            } while (iVar11 < (int)s->img_x);
          }
          stbi__skip(s,local_49ac);
          iVar38 = iVar38 + 1;
          y_00 = s->img_y;
        } while (iVar38 < (int)y_00);
      }
LAB_0010f70c:
      if ((int)sVar2 < 1) {
        uVar58 = s->img_x;
      }
      else {
        uVar58 = s->img_x;
        if (0 < (int)y_00 >> 1) {
          uVar48 = uVar58 * iVar10;
          uVar50 = (y_00 - 1) * uVar48;
          uVar54 = 0;
          uVar18 = 0;
          do {
            if (0 < (int)uVar48) {
              uVar59 = 0;
              do {
                uVar36 = puVar21[uVar59 + uVar54];
                puVar21[uVar59 + uVar54] = puVar21[uVar59 + uVar50];
                puVar21[uVar59 + uVar50] = uVar36;
                uVar59 = uVar59 + 1;
              } while (uVar48 != uVar59);
            }
            uVar18 = uVar18 + 1;
            uVar50 = uVar50 - uVar48;
            uVar54 = (ulong)((int)uVar54 + uVar48);
          } while (uVar18 != (uint)((int)y_00 >> 1));
        }
      }
      if ((req_comp != 0) && (iVar10 != req_comp)) {
        puVar21 = stbi__convert_format(puVar21,iVar10,req_comp,uVar58,y_00);
        if (puVar21 == (uchar *)0x0) {
          return (uchar *)0x0;
        }
        uVar58 = s->img_x;
      }
      *x = uVar58;
      *y = s->img_y;
      if (comp != (int *)0x0) {
        *comp = s->img_n;
        return puVar21;
      }
      return puVar21;
    }
    psVar23 = s->img_buffer_original;
    s->img_buffer = psVar23;
    if (uVar58 == 0x7c) goto LAB_0010d8b9;
    psVar33 = s->img_buffer_end;
  }
  else {
    if (s->read_from_callbacks != 0) {
      psVar23 = s->buffer_start;
      iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar23,s->buflen);
      if (iVar10 == 0) {
        s->read_from_callbacks = 0;
        psVar33 = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
        sVar8 = '\0';
      }
      else {
        psVar33 = psVar23 + iVar10;
        sVar8 = *psVar23;
      }
      s->img_buffer_end = psVar33;
      psVar24 = s->buffer_start + 1;
      s->img_buffer = psVar24;
      goto LAB_0010d7c2;
    }
LAB_0010d8dd:
    psVar23 = s->img_buffer_original;
    s->img_buffer = psVar23;
  }
  if (psVar23 < psVar33) {
    psVar24 = psVar23 + 1;
    s->img_buffer = psVar24;
    sVar8 = *psVar23;
LAB_0010d95d:
    if (sVar8 == 'G') {
      if (psVar24 < psVar33) {
        psVar23 = psVar24 + 1;
        s->img_buffer = psVar23;
        sVar8 = *psVar24;
      }
      else {
        if (s->read_from_callbacks == 0) goto LAB_0010e399;
        psVar23 = s->buffer_start;
        iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar23,s->buflen);
        if (iVar10 == 0) {
          s->read_from_callbacks = 0;
          psVar33 = s->buffer_start + 1;
          s->buffer_start[0] = '\0';
          sVar8 = '\0';
        }
        else {
          psVar33 = psVar23 + iVar10;
          sVar8 = *psVar23;
        }
        s->img_buffer_end = psVar33;
        psVar23 = s->buffer_start + 1;
        s->img_buffer = psVar23;
      }
      if (sVar8 == 'I') {
        if (psVar23 < psVar33) {
          psVar24 = psVar23 + 1;
          s->img_buffer = psVar24;
          sVar8 = *psVar23;
        }
        else {
          if (s->read_from_callbacks == 0) goto LAB_0010e399;
          psVar23 = s->buffer_start;
          iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar23,s->buflen);
          if (iVar10 == 0) {
            s->read_from_callbacks = 0;
            psVar33 = s->buffer_start + 1;
            s->buffer_start[0] = '\0';
            sVar8 = '\0';
          }
          else {
            psVar33 = psVar23 + iVar10;
            sVar8 = *psVar23;
          }
          s->img_buffer_end = psVar33;
          psVar24 = s->buffer_start + 1;
          s->img_buffer = psVar24;
        }
        if (sVar8 == 'F') {
          if (psVar24 < psVar33) {
            psVar23 = psVar24 + 1;
            s->img_buffer = psVar23;
            sVar8 = *psVar24;
          }
          else {
            if (s->read_from_callbacks == 0) goto LAB_0010e399;
            psVar23 = s->buffer_start;
            iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar23,s->buflen);
            if (iVar10 == 0) {
              s->read_from_callbacks = 0;
              psVar33 = s->buffer_start + 1;
              s->buffer_start[0] = '\0';
              sVar8 = '\0';
            }
            else {
              psVar33 = psVar23 + iVar10;
              sVar8 = *psVar23;
            }
            s->img_buffer_end = psVar33;
            psVar23 = s->buffer_start + 1;
            s->img_buffer = psVar23;
          }
          if (sVar8 == '8') {
            if (psVar23 < psVar33) {
              psVar24 = psVar23 + 1;
              s->img_buffer = psVar24;
              sVar8 = *psVar23;
            }
            else {
              if (s->read_from_callbacks == 0) goto LAB_0010e399;
              psVar23 = s->buffer_start;
              iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar23,s->buflen);
              if (iVar10 == 0) {
                s->read_from_callbacks = 0;
                psVar33 = s->buffer_start + 1;
                s->buffer_start[0] = '\0';
                sVar8 = '\0';
              }
              else {
                psVar33 = psVar23 + iVar10;
                sVar8 = *psVar23;
              }
              s->img_buffer_end = psVar33;
              psVar24 = s->buffer_start + 1;
              s->img_buffer = psVar24;
            }
            if ((sVar8 == '9') || (sVar8 == '7')) {
              if (psVar24 < psVar33) {
                s->img_buffer = psVar24 + 1;
                sVar8 = *psVar24;
              }
              else {
                if (s->read_from_callbacks == 0) goto LAB_0010e399;
                psVar23 = s->buffer_start;
                iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar23,s->buflen);
                if (iVar10 == 0) {
                  s->read_from_callbacks = 0;
                  psVar33 = s->buffer_start + 1;
                  s->buffer_start[0] = '\0';
                  sVar8 = '\0';
                }
                else {
                  psVar33 = psVar23 + iVar10;
                  sVar8 = *psVar23;
                }
                s->img_buffer_end = psVar33;
              }
              s->img_buffer = s->img_buffer_original;
              if (sVar8 != 'a') goto LAB_0010e3a9;
              memset((stbi__gif *)local_4888,0,0x4858);
              iVar10 = stbi__gif_header(s,(stbi__gif *)local_4888,comp,0);
              psVar26 = (stbi__context *)0x0;
              if (iVar10 == 0) goto LAB_0010eba9;
              iVar10 = local_4888._0_4_;
              iVar56 = local_4888._4_4_;
              iVar38 = local_4888._0_4_ * local_4888._4_4_;
              local_4888._8_8_ = malloc((long)(iVar38 * 4));
              if ((stbi__context *)local_4888._8_8_ == (stbi__context *)0x0) {
                stbi__g_failure_reason = "outofmem";
                goto LAB_0010eba2;
              }
              if (0 < iVar38 * 4) {
                lVar44 = (long)iStack_4874;
                lVar34 = 0;
                do {
                  ((stbi__context *)local_4888._8_8_)->buffer_start[lVar34 + -0x38] =
                       local_4864[lVar44 * 4 + 2];
                  ((stbi__context *)local_4888._8_8_)->buffer_start[lVar34 + -0x37] =
                       local_4864[lVar44 * 4 + 1];
                  ((stbi__context *)local_4888._8_8_)->buffer_start[lVar34 + -0x36] =
                       local_4864[lVar44 * 4];
                  ((stbi__context *)local_4888._8_8_)->buffer_start[lVar34 + -0x35] =
                       local_4864[lVar44 * 4 + 3];
                  lVar34 = lVar34 + 4;
                  iVar10 = local_4888._0_4_;
                  iVar56 = local_4888._4_4_;
                } while (lVar34 < local_4888._0_4_ * local_4888._4_4_ * 4);
              }
              local_4a10 = (stbi_uc (*) [4])local_4864;
              psVar23 = s->buffer_start;
              psVar33 = s->buffer_start + 1;
LAB_0010e635:
              pbVar17 = s->img_buffer;
              psVar24 = s->img_buffer_end;
              if (pbVar17 < psVar24) {
                s->img_buffer = pbVar17 + 1;
                bVar9 = *pbVar17;
                psVar25 = pbVar17 + 1;
              }
              else {
                if (s->read_from_callbacks == 0) goto LAB_0010eb94;
                iVar38 = (*(s->io).read)(s->io_user_data,(char *)psVar23,s->buflen);
                if (iVar38 == 0) {
                  s->read_from_callbacks = 0;
                  s->buffer_start[0] = '\0';
                  bVar9 = 0;
                  psVar24 = psVar33;
                }
                else {
                  bVar9 = *psVar23;
                  psVar24 = psVar23 + iVar38;
                }
                s->img_buffer_end = psVar24;
                s->img_buffer = psVar33;
                psVar25 = psVar33;
              }
              if (bVar9 == 0x21) {
                if (psVar25 < psVar24) {
                  s->img_buffer = psVar25 + 1;
                  bVar9 = *psVar25;
                  psVar25 = psVar25 + 1;
                }
                else {
                  if (s->read_from_callbacks == 0) goto LAB_0010e8c1;
                  iVar38 = (*(s->io).read)(s->io_user_data,(char *)psVar23,s->buflen);
                  if (iVar38 == 0) {
                    s->read_from_callbacks = 0;
                    s->buffer_start[0] = '\0';
                    bVar9 = 0;
                    psVar24 = psVar33;
                  }
                  else {
                    bVar9 = *psVar23;
                    psVar24 = psVar23 + iVar38;
                  }
                  s->img_buffer_end = psVar24;
                  s->img_buffer = psVar33;
                  psVar25 = psVar33;
                }
                if (bVar9 != 0xf9) goto LAB_0010e8c1;
                if (psVar25 < psVar24) {
                  s->img_buffer = psVar25 + 1;
                  bVar9 = *psVar25;
                  psVar25 = psVar25 + 1;
LAB_0010e792:
                  if (bVar9 == 4) {
                    if (psVar25 < psVar24) {
                      s->img_buffer = psVar25 + 1;
                      local_4868 = (uint)*psVar25;
                    }
                    else if (s->read_from_callbacks == 0) {
                      local_4868 = 0;
                    }
                    else {
                      iVar38 = (*(s->io).read)(s->io_user_data,(char *)psVar23,s->buflen);
                      if (iVar38 == 0) {
                        s->read_from_callbacks = 0;
                        s->buffer_start[0] = '\0';
                        local_4868 = 0;
                        psVar24 = psVar33;
                      }
                      else {
                        local_4868 = (uint)*psVar23;
                        psVar24 = psVar23 + iVar38;
                      }
                      s->img_buffer_end = psVar24;
                      s->img_buffer = psVar33;
                    }
                    stbi__get16le(s);
                    psVar25 = s->img_buffer;
                    psVar24 = s->img_buffer_end;
                    if (psVar25 < psVar24) {
                      s->img_buffer = psVar25 + 1;
                      bVar9 = *psVar25;
                      psVar25 = psVar25 + 1;
                    }
                    else if (s->read_from_callbacks == 0) {
                      bVar9 = 0;
                    }
                    else {
                      iVar38 = (*(s->io).read)(s->io_user_data,(char *)psVar23,s->buflen);
                      if (iVar38 == 0) {
                        s->read_from_callbacks = 0;
                        s->buffer_start[0] = '\0';
                        bVar9 = 0;
                        psVar24 = psVar33;
                      }
                      else {
                        bVar9 = *psVar23;
                        psVar24 = psVar23 + iVar38;
                      }
                      s->img_buffer_end = psVar24;
                      s->img_buffer = psVar33;
                      psVar25 = psVar33;
                    }
                    uStack_486c = (uint)bVar9;
LAB_0010e8c1:
                    do {
                      if (psVar25 < psVar24) {
                        s->img_buffer = psVar25 + 1;
                        bVar9 = *psVar25;
                      }
                      else {
                        if (s->read_from_callbacks == 0) goto LAB_0010e635;
                        iVar38 = (*(s->io).read)(s->io_user_data,(char *)psVar23,s->buflen);
                        if (iVar38 == 0) {
                          s->read_from_callbacks = 0;
                          s->buffer_start[0] = '\0';
                          bVar9 = 0;
                          psVar24 = psVar33;
                        }
                        else {
                          bVar9 = *psVar23;
                          psVar24 = psVar23 + iVar38;
                        }
                        s->img_buffer_end = psVar24;
                        s->img_buffer = psVar33;
                      }
                      if (bVar9 == 0) goto LAB_0010e635;
                      stbi__skip(s,(uint)bVar9);
                      psVar25 = s->img_buffer;
                      psVar24 = s->img_buffer_end;
                    } while( true );
                  }
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    iVar38 = (*(s->io).read)(s->io_user_data,(char *)psVar23,s->buflen);
                    if (iVar38 == 0) {
                      s->read_from_callbacks = 0;
                      s->buffer_start[0] = '\0';
                      bVar9 = 0;
                      psVar24 = psVar33;
                    }
                    else {
                      bVar9 = *psVar23;
                      psVar24 = psVar23 + iVar38;
                    }
                    s->img_buffer_end = psVar24;
                    s->img_buffer = psVar33;
                    psVar25 = psVar33;
                    goto LAB_0010e792;
                  }
                  bVar9 = 0;
                }
                stbi__skip(s,(uint)bVar9);
                goto LAB_0010e635;
              }
              psVar26 = s;
              if (bVar9 == 0x3b) goto LAB_0010eba9;
              if (bVar9 == 0x2c) {
                iVar38 = stbi__get16le(s);
                iVar30 = stbi__get16le(s);
                iVar11 = stbi__get16le(s);
                iVar12 = stbi__get16le(s);
                if ((iVar10 < iVar11 + iVar38) || (iVar56 < iVar12 + iVar30)) {
                  stbi__g_failure_reason = "bad Image Descriptor";
                }
                else {
                  iVar56 = iVar10 * 4;
                  local_34 = iVar56;
                  local_4c = iVar38 << 2;
                  local_48 = iVar30 * iVar56;
                  local_44 = (iVar11 + iVar38) * 4;
                  local_40 = (iVar12 + iVar30) * iVar56;
                  local_3c = iVar38 << 2;
                  local_38 = iVar30 * iVar56;
                  psVar24 = s->img_buffer;
                  psVar25 = s->img_buffer_end;
                  if (psVar24 < psVar25) {
                    s->img_buffer = psVar24 + 1;
                    local_50 = (uint)*psVar24;
                    psVar24 = psVar24 + 1;
LAB_0010f929:
                    local_54 = iVar10 << 5;
                    if ((local_50 & 0x40) == 0) {
                      local_54 = iVar56;
                    }
                    local_58 = (int)(local_50 << 0x19) >> 0x1f & 3;
                    if (-1 < (char)(byte)local_50) goto LAB_0010f95e;
                    local_4a10 = (stbi_uc (*) [4])(local_4864 + 0x400);
                    stbi__gif_parse_colortable
                              (s,local_4a10,2 << ((byte)local_50 & 7),
                               -(uint)((local_4868 & 1) == 0) | uStack_486c);
                    psVar24 = s->img_buffer;
                    psVar25 = s->img_buffer_end;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      iVar38 = (*(s->io).read)(s->io_user_data,(char *)psVar23,s->buflen);
                      if (iVar38 == 0) {
                        s->read_from_callbacks = 0;
                        s->buffer_start[0] = '\0';
                        local_50 = 0;
                        psVar25 = psVar33;
                      }
                      else {
                        local_50 = (uint)*psVar23;
                        psVar25 = psVar23 + iVar38;
                      }
                      s->img_buffer_end = psVar25;
                      s->img_buffer = psVar33;
                      psVar24 = psVar33;
                      goto LAB_0010f929;
                    }
                    local_50 = 0;
                    local_54 = iVar56;
                    local_58 = 0;
LAB_0010f95e:
                    if ((local_4878 & 0x80) == 0) {
                      stbi__g_failure_reason = "missing color table";
                      goto LAB_0010eba2;
                    }
                    lVar44 = 0;
                    do {
                      local_4864[lVar44 * 4 + 3] = 0xff;
                      lVar44 = lVar44 + 1;
                    } while (lVar44 != 0x100);
                    if ((-1 < (long)(int)uStack_486c) && ((local_4868 & 1) != 0)) {
                      local_4864[(long)(int)uStack_486c * 4 + 3] = '\0';
                    }
                  }
                  local_60 = local_4a10;
                  if (psVar24 < psVar25) {
                    s->img_buffer = psVar24 + 1;
                    bVar9 = *psVar24;
LAB_0010fa63:
                    if (0xc < bVar9) goto LAB_0010eba2;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar23,s->buflen);
                      if (iVar10 == 0) {
                        s->read_from_callbacks = 0;
                        s->buffer_start[0] = '\0';
                        bVar9 = 0;
                        psVar24 = psVar33;
                      }
                      else {
                        bVar9 = *psVar23;
                        psVar24 = psVar23 + iVar10;
                      }
                      s->img_buffer_end = psVar24;
                      s->img_buffer = psVar33;
                      goto LAB_0010fa63;
                    }
                    bVar9 = 0;
                  }
                  uVar58 = 1 << (bVar9 & 0x1f);
                  uVar54 = 0;
                  do {
                    *(undefined2 *)(auStack_4062 + uVar54 * 4 + -2) = 0xffff;
                    auStack_4062[uVar54 * 4] = (char)uVar54;
                    auStack_4062[uVar54 * 4 + 1] = (char)uVar54;
                    uVar54 = uVar54 + 1;
                  } while (uVar58 != uVar54);
                  uVar32 = (2 << (bVar9 & 0x1f)) - 1;
                  uVar48 = 0;
                  iVar10 = 0;
                  uVar50 = 0;
                  bVar61 = false;
                  uVar41 = uVar58 + 2;
                  uVar13 = 0xffffffff;
                  iVar56 = bVar9 + 1;
                  uVar14 = uVar32;
                  while( true ) {
                    do {
                      for (; uVar15 = uVar14, iVar38 = iVar56, uVar42 = uVar13, local_4a20 = uVar41,
                          bVar6 = bVar61, iVar56 = iVar10 - iVar38, iVar10 < iVar38;
                          iVar10 = iVar10 + 8) {
                        psVar24 = s->img_buffer;
                        psVar25 = s->img_buffer_end;
                        if (uVar48 == 0) {
                          if (psVar24 < psVar25) {
                            s->img_buffer = psVar24 + 1;
                            bVar27 = *psVar24;
                            psVar24 = psVar24 + 1;
                          }
                          else {
                            if (s->read_from_callbacks == 0) goto LAB_0010fdc2;
                            iVar56 = (*(s->io).read)(s->io_user_data,(char *)psVar23,s->buflen);
                            if (iVar56 == 0) {
                              s->read_from_callbacks = 0;
                              s->buffer_start[0] = '\0';
                              bVar27 = 0;
                              psVar25 = psVar33;
                            }
                            else {
                              bVar27 = *psVar23;
                              psVar25 = psVar23 + iVar56;
                            }
                            s->img_buffer_end = psVar25;
                            s->img_buffer = psVar33;
                            psVar24 = psVar33;
                          }
                          if (bVar27 == 0) goto LAB_0010fdc2;
                          uVar48 = (uint)bVar27;
                        }
                        if (psVar24 < psVar25) {
                          s->img_buffer = psVar24 + 1;
                          uVar41 = (uint)*psVar24;
                        }
                        else if (s->read_from_callbacks == 0) {
                          uVar41 = 0;
                        }
                        else {
                          iVar56 = (*(s->io).read)(s->io_user_data,(char *)psVar23,s->buflen);
                          if (iVar56 == 0) {
                            s->read_from_callbacks = 0;
                            s->buffer_start[0] = '\0';
                            uVar41 = 0;
                            psVar24 = psVar33;
                          }
                          else {
                            uVar41 = (uint)*psVar23;
                            psVar24 = psVar23 + iVar56;
                          }
                          s->img_buffer_end = psVar24;
                          s->img_buffer = psVar33;
                        }
                        bVar27 = (byte)iVar10;
                        uVar48 = uVar48 - 1;
                        uVar50 = uVar50 | uVar41 << (bVar27 & 0x1f);
                        bVar61 = bVar6;
                        uVar41 = local_4a20;
                        uVar13 = uVar42;
                        iVar56 = iVar38;
                        uVar14 = uVar15;
                      }
                      uVar41 = (int)uVar50 >> ((byte)iVar38 & 0x1f);
                      uVar57 = uVar50 & uVar15;
                      iVar10 = iVar56;
                      uVar50 = uVar41;
                      bVar61 = true;
                      uVar41 = uVar58 + 2;
                      uVar13 = 0xffffffff;
                      iVar56 = bVar9 + 1;
                      uVar14 = uVar32;
                    } while (uVar57 == uVar58);
                    if (uVar57 == uVar58 + 1) goto LAB_0010fd42;
                    if ((int)local_4a20 < (int)uVar57) break;
                    if (!bVar6) {
                      stbi__g_failure_reason = "no clear code";
                      goto LAB_0010eba2;
                    }
                    if ((int)uVar42 < 0) {
                      if (uVar57 == local_4a20) break;
                    }
                    else {
                      if (0xfff < (int)local_4a20) {
                        stbi__g_failure_reason = "too many codes";
                        goto LAB_0010eba2;
                      }
                      lVar44 = (long)(int)local_4a20;
                      local_4a20 = local_4a20 + 1;
                      *(short *)(auStack_4062 + lVar44 * 4 + -2) = (short)uVar42;
                      uVar28 = auStack_4062[(ulong)uVar42 * 4];
                      auStack_4062[lVar44 * 4] = uVar28;
                      if (uVar57 != local_4a20) {
                        uVar28 = auStack_4062[(long)(int)uVar57 * 4];
                      }
                      auStack_4062[lVar44 * 4 + 1] = uVar28;
                    }
                    stbi__out_gif_code((stbi__gif *)local_4888,(stbi__uint16)uVar57);
                    bVar61 = true;
                    uVar41 = local_4a20;
                    uVar13 = uVar57;
                    iVar56 = iVar38 + 1;
                    uVar14 = ~(-1 << ((byte)(iVar38 + 1) & 0x1f));
                    if (0xfff < (int)local_4a20 || (local_4a20 & uVar15) != 0) {
                      iVar56 = iVar38;
                      uVar14 = uVar15;
                    }
                  }
                  stbi__g_failure_reason = "illegal code in raster";
                }
              }
              else {
LAB_0010eb94:
                stbi__g_failure_reason = "unknown code";
              }
LAB_0010eba2:
              psVar26 = (stbi__context *)0x0;
LAB_0010eba9:
              psVar60 = (stbi__context *)0x0;
              if (psVar26 != s) {
                psVar60 = psVar26;
              }
              if (psVar60 != (stbi__context *)0x0) {
                *x = local_4888._0_4_;
                *y = local_4888._4_4_;
                return (uchar *)psVar60;
              }
              return (uchar *)0x0;
            }
          }
        }
      }
    }
  }
  else if (s->read_from_callbacks != 0) {
    psVar23 = s->buffer_start;
    iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar23,s->buflen);
    if (iVar10 == 0) {
      s->read_from_callbacks = 0;
      psVar33 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      sVar8 = '\0';
    }
    else {
      psVar33 = psVar23 + iVar10;
      sVar8 = *psVar23;
    }
    s->img_buffer_end = psVar33;
    psVar24 = s->buffer_start + 1;
    s->img_buffer = psVar24;
    goto LAB_0010d95d;
  }
LAB_0010e399:
  s->img_buffer = s->img_buffer_original;
LAB_0010e3a9:
  iVar10 = stbi__psd_test(s);
  if (iVar10 != 0) {
    psVar23 = stbi__psd_load(s,x,y,comp,req_comp);
    return psVar23;
  }
  iVar10 = stbi__pic_test(s);
  if (iVar10 != 0) {
    psVar23 = stbi__pic_load(s,x,y,comp,req_comp);
    return psVar23;
  }
  iVar10 = stbi__pnm_test(s);
  if (iVar10 != 0) {
    psVar23 = stbi__pnm_load(s,x,y,comp,req_comp);
    return psVar23;
  }
  iVar10 = stbi__hdr_test(s);
  if (iVar10 == 0) {
    iVar10 = stbi__tga_test(s);
    if (iVar10 == 0) {
      stbi__g_failure_reason = "unknown image type";
      return (uchar *)0x0;
    }
    psVar23 = stbi__tga_load(s,x,y,comp,req_comp);
    return psVar23;
  }
  data_00 = stbi__hdr_load(s,x,y,comp,req_comp);
  if (req_comp == 0) {
    req_comp = *comp;
  }
  psVar23 = stbi__hdr_to_ldr(data_00,*x,*y,req_comp);
  return psVar23;
LAB_0010d4de:
  bVar61 = false;
LAB_0010d4e0:
  if (!bVar61) goto LAB_0010e0cf;
LAB_0010d4ef:
  if (local_160 == 0xff) {
LAB_0010d4f7:
    do {
      uVar3 = local_4888._0_8_;
      if (((stbi_io_callbacks *)(local_4888._0_8_ + 0x10))->read ==
          (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0010d51b:
        if (*(stbi_uc **)(uVar3 + 0xc0) <= *(stbi_uc **)(uVar3 + 0xb8)) goto LAB_0010c292;
      }
      else {
        iVar10 = (*((stbi_io_callbacks *)(local_4888._0_8_ + 0x10))->eof)
                           (*(void **)(local_4888._0_8_ + 0x28));
        if (iVar10 != 0) {
          if (*(int *)(uVar3 + 0x30) != 0) goto LAB_0010d51b;
          goto LAB_0010c292;
        }
      }
      uVar3 = local_4888._0_8_;
      psVar23 = *(stbi_uc **)(local_4888._0_8_ + 0xb8);
      if (psVar23 < *(stbi_uc **)(local_4888._0_8_ + 0xc0)) {
        *(stbi_uc **)(local_4888._0_8_ + 0xb8) = psVar23 + 1;
        sVar8 = *psVar23;
      }
      else {
        if (*(int *)(local_4888._0_8_ + 0x30) == 0) goto LAB_0010d4f7;
        psVar23 = (stbi_uc *)(local_4888._0_8_ + 0x38);
        iVar10 = (*((stbi_io_callbacks *)(local_4888._0_8_ + 0x10))->read)
                           (*(void **)(local_4888._0_8_ + 0x28),(char *)psVar23,
                            *(int *)(local_4888._0_8_ + 0x34));
        if (iVar10 == 0) {
          *(int *)(uVar3 + 0x30) = 0;
          psVar33 = (stbi_uc *)(uVar3 + 0x38) + 1;
          *(stbi_uc *)(uVar3 + 0x38) = '\0';
          sVar8 = '\0';
        }
        else {
          psVar33 = psVar23 + iVar10;
          sVar8 = *psVar23;
        }
        *(stbi_uc **)(uVar3 + 0xc0) = psVar33;
        *(stbi_uc **)(uVar3 + 0xb8) = (stbi_uc *)(uVar3 + 0x38) + 1;
      }
      uVar3 = local_4888._0_8_;
    } while (sVar8 == '\0');
    if (sVar8 != 0xff) {
      stbi__g_failure_reason = "junk before marker";
      goto LAB_0010e0cf;
    }
    pbVar17 = *(stbi_uc **)(local_4888._0_8_ + 0xb8);
    if (pbVar17 < *(stbi_uc **)(local_4888._0_8_ + 0xc0)) {
      *(byte **)(local_4888._0_8_ + 0xb8) = pbVar17 + 1;
      local_160 = *pbVar17;
    }
    else if (*(int *)(local_4888._0_8_ + 0x30) == 0) {
      local_160 = 0;
    }
    else {
      psVar23 = (stbi_uc *)(local_4888._0_8_ + 0x38);
      iVar10 = (*((stbi_io_callbacks *)(local_4888._0_8_ + 0x10))->read)
                         (*(void **)(local_4888._0_8_ + 0x28),(char *)psVar23,
                          *(int *)(local_4888._0_8_ + 0x34));
      if (iVar10 == 0) {
        *(int *)(uVar3 + 0x30) = 0;
        psVar33 = (stbi_uc *)(uVar3 + 0x38) + 1;
        *(stbi_uc *)(uVar3 + 0x38) = '\0';
        local_160 = 0;
      }
      else {
        psVar33 = psVar23 + iVar10;
        local_160 = *psVar23;
      }
      *(stbi_uc **)(uVar3 + 0xc0) = psVar33;
      *(stbi_uc **)(uVar3 + 0xb8) = (stbi_uc *)(uVar3 + 0x38) + 1;
    }
  }
LAB_0010c292:
  bVar9 = stbi__get_marker((stbi__jpeg *)local_4888);
  goto LAB_0010c26a;
LAB_0010eb2a:
  local_168._4_4_ = (stbi__gif_lzw)((int)local_168._4_4_ + -0x10);
LAB_0010eb34:
  stbi__g_failure_reason = "bad huffman code";
  goto LAB_0010e0cf;
LAB_0010fd42:
  stbi__skip(s,uVar48);
  pbVar17 = s->img_buffer;
  if (pbVar17 < s->img_buffer_end) {
    s->img_buffer = pbVar17 + 1;
    bVar9 = *pbVar17;
  }
  else {
    if (s->read_from_callbacks == 0) goto LAB_0010fdc2;
    iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar23,s->buflen);
    if (iVar10 == 0) {
      s->read_from_callbacks = 0;
      s->buffer_start[0] = '\0';
      bVar9 = 0;
      psVar24 = psVar33;
    }
    else {
      bVar9 = *psVar23;
      psVar24 = psVar23 + iVar10;
    }
    s->img_buffer_end = psVar24;
    s->img_buffer = psVar33;
  }
  if (bVar9 == 0) goto LAB_0010fdc2;
  uVar48 = (uint)bVar9;
  goto LAB_0010fd42;
LAB_0010fdc2:
  if ((stbi__context *)local_4888._8_8_ != (stbi__context *)0x0) {
    psVar26 = (stbi__context *)local_4888._8_8_;
    if ((req_comp & 0xfffffffbU) != 0) {
      psVar26 = (stbi__context *)
                stbi__convert_format
                          ((uchar *)local_4888._8_8_,4,req_comp,local_4888._0_4_,local_4888._4_4_);
    }
    goto LAB_0010eba9;
  }
  goto LAB_0010eba2;
}

Assistant:

static unsigned char *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}